

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [12];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  byte bVar64;
  byte bVar65;
  ulong uVar66;
  byte bVar67;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar68;
  long lVar69;
  byte bVar70;
  undefined1 uVar71;
  undefined1 uVar72;
  byte bVar73;
  ulong uVar74;
  ulong uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar128;
  uint uVar129;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  uint uVar130;
  uint uVar134;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar84 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float pp;
  float fVar135;
  undefined4 uVar136;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar137;
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar150;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar160 [32];
  undefined1 auVar151 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar225 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined4 uVar233;
  undefined4 uVar234;
  undefined4 uVar235;
  undefined4 uVar236;
  undefined4 uVar237;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9d0 [16];
  ulong local_9b8;
  uint local_9b0;
  int local_9ac;
  float local_9a8;
  float local_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  RTCHitN local_460 [16];
  undefined1 auStack_450 [16];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [16];
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  uint local_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  uint uStack_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar5 = prim[1];
  uVar75 = (ulong)(byte)PVar5;
  fVar203 = *(float *)(prim + uVar75 * 0x19 + 0x12);
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar87 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar84 = vsubps_avx(auVar80,*(undefined1 (*) [16])(prim + uVar75 * 0x19 + 6));
  fVar202 = fVar203 * auVar84._0_4_;
  fVar135 = fVar203 * auVar87._0_4_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar75 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar80);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar75 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar86);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar75 * 6 + 6);
  auVar94 = vpmovsxbd_avx2(auVar78);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar75 * 0xb + 6);
  auVar95 = vpmovsxbd_avx2(auVar85);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar100 = vpmovsxbd_avx2(auVar81);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar96 = vcvtdq2ps_avx(auVar100);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar75 + 6);
  auVar92 = vpmovsxbd_avx2(auVar82);
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar66 = (ulong)(uint)((int)(uVar75 * 9) * 2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar97 = vpmovsxbd_avx2(auVar83);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 + uVar75 + 6);
  auVar98 = vpmovsxbd_avx2(auVar79);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar74 = (ulong)(uint)((int)(uVar75 * 5) << 2);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *(ulong *)(prim + uVar74 + 6);
  auVar90 = vpmovsxbd_avx2(auVar251);
  auVar99 = vcvtdq2ps_avx(auVar90);
  auVar110._4_4_ = fVar135;
  auVar110._0_4_ = fVar135;
  auVar110._8_4_ = fVar135;
  auVar110._12_4_ = fVar135;
  auVar110._16_4_ = fVar135;
  auVar110._20_4_ = fVar135;
  auVar110._24_4_ = fVar135;
  auVar110._28_4_ = fVar135;
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = ZEXT1632(CONCAT412(fVar203 * auVar87._12_4_,
                                CONCAT48(fVar203 * auVar87._8_4_,
                                         CONCAT44(fVar203 * auVar87._4_4_,fVar135))));
  auVar101 = vpermps_avx2(auVar111,auVar102);
  auVar89 = vpermps_avx512vl(auVar88,auVar102);
  fVar135 = auVar89._0_4_;
  fVar164 = auVar89._4_4_;
  auVar102._4_4_ = fVar164 * auVar94._4_4_;
  auVar102._0_4_ = fVar135 * auVar94._0_4_;
  fVar166 = auVar89._8_4_;
  auVar102._8_4_ = fVar166 * auVar94._8_4_;
  fVar168 = auVar89._12_4_;
  auVar102._12_4_ = fVar168 * auVar94._12_4_;
  fVar137 = auVar89._16_4_;
  auVar102._16_4_ = fVar137 * auVar94._16_4_;
  fVar170 = auVar89._20_4_;
  auVar102._20_4_ = fVar170 * auVar94._20_4_;
  fVar172 = auVar89._24_4_;
  auVar102._24_4_ = fVar172 * auVar94._24_4_;
  auVar102._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar92._4_4_ * fVar164;
  auVar100._0_4_ = auVar92._0_4_ * fVar135;
  auVar100._8_4_ = auVar92._8_4_ * fVar166;
  auVar100._12_4_ = auVar92._12_4_ * fVar168;
  auVar100._16_4_ = auVar92._16_4_ * fVar137;
  auVar100._20_4_ = auVar92._20_4_ * fVar170;
  auVar100._24_4_ = auVar92._24_4_ * fVar172;
  auVar100._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar99._4_4_ * fVar164;
  auVar90._0_4_ = auVar99._0_4_ * fVar135;
  auVar90._8_4_ = auVar99._8_4_ * fVar166;
  auVar90._12_4_ = auVar99._12_4_ * fVar168;
  auVar90._16_4_ = auVar99._16_4_ * fVar137;
  auVar90._20_4_ = auVar99._20_4_ * fVar170;
  auVar90._24_4_ = auVar99._24_4_ * fVar172;
  auVar90._28_4_ = auVar89._28_4_;
  auVar80 = vfmadd231ps_fma(auVar102,auVar101,auVar91);
  auVar86 = vfmadd231ps_fma(auVar100,auVar101,auVar96);
  auVar78 = vfmadd231ps_fma(auVar90,auVar98,auVar101);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar110,auVar93);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar110,auVar95);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar97,auVar110);
  auVar213._4_4_ = fVar202;
  auVar213._0_4_ = fVar202;
  auVar213._8_4_ = fVar202;
  auVar213._12_4_ = fVar202;
  auVar213._16_4_ = fVar202;
  auVar213._20_4_ = fVar202;
  auVar213._24_4_ = fVar202;
  auVar213._28_4_ = fVar202;
  auVar90 = ZEXT1632(CONCAT412(fVar203 * auVar84._12_4_,
                               CONCAT48(fVar203 * auVar84._8_4_,
                                        CONCAT44(fVar203 * auVar84._4_4_,fVar202))));
  auVar100 = vpermps_avx2(auVar111,auVar90);
  auVar90 = vpermps_avx512vl(auVar88,auVar90);
  fVar203 = auVar90._0_4_;
  fVar135 = auVar90._4_4_;
  auVar101._4_4_ = fVar135 * auVar94._4_4_;
  auVar101._0_4_ = fVar203 * auVar94._0_4_;
  fVar164 = auVar90._8_4_;
  auVar101._8_4_ = fVar164 * auVar94._8_4_;
  fVar166 = auVar90._12_4_;
  auVar101._12_4_ = fVar166 * auVar94._12_4_;
  fVar168 = auVar90._16_4_;
  auVar101._16_4_ = fVar168 * auVar94._16_4_;
  fVar137 = auVar90._20_4_;
  auVar101._20_4_ = fVar137 * auVar94._20_4_;
  fVar170 = auVar90._24_4_;
  auVar101._24_4_ = fVar170 * auVar94._24_4_;
  auVar101._28_4_ = 1;
  auVar88._4_4_ = auVar92._4_4_ * fVar135;
  auVar88._0_4_ = auVar92._0_4_ * fVar203;
  auVar88._8_4_ = auVar92._8_4_ * fVar164;
  auVar88._12_4_ = auVar92._12_4_ * fVar166;
  auVar88._16_4_ = auVar92._16_4_ * fVar168;
  auVar88._20_4_ = auVar92._20_4_ * fVar137;
  auVar88._24_4_ = auVar92._24_4_ * fVar170;
  auVar88._28_4_ = auVar94._28_4_;
  auVar92._4_4_ = auVar99._4_4_ * fVar135;
  auVar92._0_4_ = auVar99._0_4_ * fVar203;
  auVar92._8_4_ = auVar99._8_4_ * fVar164;
  auVar92._12_4_ = auVar99._12_4_ * fVar166;
  auVar92._16_4_ = auVar99._16_4_ * fVar168;
  auVar92._20_4_ = auVar99._20_4_ * fVar137;
  auVar92._24_4_ = auVar99._24_4_ * fVar170;
  auVar92._28_4_ = auVar90._28_4_;
  auVar85 = vfmadd231ps_fma(auVar101,auVar100,auVar91);
  auVar81 = vfmadd231ps_fma(auVar88,auVar100,auVar96);
  auVar82 = vfmadd231ps_fma(auVar92,auVar100,auVar98);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar213,auVar93);
  auVar242 = ZEXT1664(auVar85);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar213,auVar95);
  auVar107._8_4_ = 0x7fffffff;
  auVar107._0_8_ = 0x7fffffff7fffffff;
  auVar107._12_4_ = 0x7fffffff;
  auVar107._16_4_ = 0x7fffffff;
  auVar107._20_4_ = 0x7fffffff;
  auVar107._24_4_ = 0x7fffffff;
  auVar107._28_4_ = 0x7fffffff;
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar213,auVar97);
  auVar93 = vandps_avx(ZEXT1632(auVar80),auVar107);
  auVar109._8_4_ = 0x219392ef;
  auVar109._0_8_ = 0x219392ef219392ef;
  auVar109._12_4_ = 0x219392ef;
  auVar109._16_4_ = 0x219392ef;
  auVar109._20_4_ = 0x219392ef;
  auVar109._24_4_ = 0x219392ef;
  auVar109._28_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar93,auVar109,1);
  bVar8 = (bool)((byte)uVar66 & 1);
  auVar89._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._0_4_;
  bVar8 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._4_4_;
  bVar8 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._8_4_;
  bVar8 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar80._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar86),auVar107);
  uVar66 = vcmpps_avx512vl(auVar93,auVar109,1);
  bVar8 = (bool)((byte)uVar66 & 1);
  auVar103._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar86._0_4_;
  bVar8 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar86._4_4_;
  bVar8 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar86._8_4_;
  bVar8 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar86._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar78),auVar107);
  uVar66 = vcmpps_avx512vl(auVar93,auVar109,1);
  bVar8 = (bool)((byte)uVar66 & 1);
  auVar93._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar78._0_4_;
  bVar8 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar78._4_4_;
  bVar8 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar78._8_4_;
  bVar8 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar78._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar91 = vrcp14ps_avx512vl(auVar89);
  auVar108._8_4_ = 0x3f800000;
  auVar108._0_8_ = 0x3f8000003f800000;
  auVar108._12_4_ = 0x3f800000;
  auVar108._16_4_ = 0x3f800000;
  auVar108._20_4_ = 0x3f800000;
  auVar108._24_4_ = 0x3f800000;
  auVar108._28_4_ = 0x3f800000;
  auVar80 = vfnmadd213ps_fma(auVar89,auVar91,auVar108);
  auVar80 = vfmadd132ps_fma(ZEXT1632(auVar80),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar103);
  auVar86 = vfnmadd213ps_fma(auVar103,auVar91,auVar108);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar91,auVar91);
  auVar91 = vrcp14ps_avx512vl(auVar93);
  auVar78 = vfnmadd213ps_fma(auVar93,auVar91,auVar108);
  auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar91,auVar91);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar85));
  auVar97._4_4_ = auVar80._4_4_ * auVar93._4_4_;
  auVar97._0_4_ = auVar80._0_4_ * auVar93._0_4_;
  auVar97._8_4_ = auVar80._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar80._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar85));
  auVar92 = vpbroadcastd_avx512vl();
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar106._0_4_ = auVar80._0_4_ * auVar93._0_4_;
  auVar106._4_4_ = auVar80._4_4_ * auVar93._4_4_;
  auVar106._8_4_ = auVar80._8_4_ * auVar93._8_4_;
  auVar106._12_4_ = auVar80._12_4_ * auVar93._12_4_;
  auVar106._16_4_ = auVar93._16_4_ * 0.0;
  auVar106._20_4_ = auVar93._20_4_ * 0.0;
  auVar106._24_4_ = auVar93._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar5 * 0x10 + uVar75 * -2 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar81));
  auVar98._4_4_ = auVar86._4_4_ * auVar93._4_4_;
  auVar98._0_4_ = auVar86._0_4_ * auVar93._0_4_;
  auVar98._8_4_ = auVar86._8_4_ * auVar93._8_4_;
  auVar98._12_4_ = auVar86._12_4_ * auVar93._12_4_;
  auVar98._16_4_ = auVar93._16_4_ * 0.0;
  auVar98._20_4_ = auVar93._20_4_ * 0.0;
  auVar98._24_4_ = auVar93._24_4_ * 0.0;
  auVar98._28_4_ = auVar93._28_4_;
  auVar93 = vcvtdq2ps_avx(auVar91);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar81));
  auVar105._0_4_ = auVar86._0_4_ * auVar93._0_4_;
  auVar105._4_4_ = auVar86._4_4_ * auVar93._4_4_;
  auVar105._8_4_ = auVar86._8_4_ * auVar93._8_4_;
  auVar105._12_4_ = auVar86._12_4_ * auVar93._12_4_;
  auVar105._16_4_ = auVar93._16_4_ * 0.0;
  auVar105._20_4_ = auVar93._20_4_ * 0.0;
  auVar105._24_4_ = auVar93._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar74 + uVar75 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar82));
  auVar99._4_4_ = auVar93._4_4_ * auVar78._4_4_;
  auVar99._0_4_ = auVar93._0_4_ * auVar78._0_4_;
  auVar99._8_4_ = auVar93._8_4_ * auVar78._8_4_;
  auVar99._12_4_ = auVar93._12_4_ * auVar78._12_4_;
  auVar99._16_4_ = auVar93._16_4_ * 0.0;
  auVar99._20_4_ = auVar93._20_4_ * 0.0;
  auVar99._24_4_ = auVar93._24_4_ * 0.0;
  auVar99._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar75 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar82));
  auVar104._0_4_ = auVar78._0_4_ * auVar93._0_4_;
  auVar104._4_4_ = auVar78._4_4_ * auVar93._4_4_;
  auVar104._8_4_ = auVar78._8_4_ * auVar93._8_4_;
  auVar104._12_4_ = auVar78._12_4_ * auVar93._12_4_;
  auVar104._16_4_ = auVar93._16_4_ * 0.0;
  auVar104._20_4_ = auVar93._20_4_ * 0.0;
  auVar104._24_4_ = auVar93._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar97,auVar106);
  auVar91 = vpminsd_avx2(auVar98,auVar105);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91 = vpminsd_avx2(auVar99,auVar104);
  uVar136 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar94._4_4_ = uVar136;
  auVar94._0_4_ = uVar136;
  auVar94._8_4_ = uVar136;
  auVar94._12_4_ = uVar136;
  auVar94._16_4_ = uVar136;
  auVar94._20_4_ = uVar136;
  auVar94._24_4_ = uVar136;
  auVar94._28_4_ = uVar136;
  auVar91 = vmaxps_avx512vl(auVar91,auVar94);
  auVar93 = vmaxps_avx(auVar93,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar93,auVar91);
  auVar93 = vpmaxsd_avx2(auVar97,auVar106);
  auVar91 = vpmaxsd_avx2(auVar98,auVar105);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar91 = vpmaxsd_avx2(auVar99,auVar104);
  uVar136 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar136;
  auVar95._0_4_ = uVar136;
  auVar95._8_4_ = uVar136;
  auVar95._12_4_ = uVar136;
  auVar95._16_4_ = uVar136;
  auVar95._20_4_ = uVar136;
  auVar95._24_4_ = uVar136;
  auVar95._28_4_ = uVar136;
  auVar91 = vminps_avx512vl(auVar91,auVar95);
  auVar93 = vminps_avx(auVar93,auVar91);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar96);
  uVar18 = vpcmpgtd_avx512vl(auVar92,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_280,auVar93,2);
  if ((byte)((byte)uVar16 & (byte)uVar18) == 0) {
    return;
  }
  local_608 = (ulong)(byte)((byte)uVar16 & (byte)uVar18);
  local_490 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_610 = prim;
LAB_01cd9b1c:
  lVar69 = 0;
  for (uVar66 = local_608; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    lVar69 = lVar69 + 1;
  }
  uVar68 = *(uint *)(prim + 2);
  local_9b8 = (ulong)*(uint *)(prim + lVar69 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar68].ptr;
  lVar69 = *(long *)&pGVar6[1].time_range.upper;
  uVar66 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_9b8 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar80 = *(undefined1 (*) [16])(lVar69 + (long)pGVar6[1].intersectionFilterN * uVar66);
  auVar86 = *(undefined1 (*) [16])(lVar69 + (long)pGVar6[1].intersectionFilterN * (uVar66 + 1));
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar85 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3a0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar78 = vunpcklps_avx512vl(local_3a0._0_16_,local_3c0._0_16_);
  local_700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar252 = ZEXT3264(local_700);
  auVar251 = local_700._0_16_;
  local_710 = vinsertps_avx512f(auVar78,auVar251,0x28);
  auVar84._8_4_ = 0xbeaaaaab;
  auVar84._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar84._12_4_ = 0xbeaaaaab;
  auVar82 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar6[2].intersectionFilterN +
                              uVar66 * (long)pGVar6[2].pointQueryFunc),auVar80,auVar84);
  auVar81 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar6[2].intersectionFilterN +
                             (long)pGVar6[2].pointQueryFunc * (uVar66 + 1)),auVar86,auVar84);
  auVar215._0_4_ = auVar86._0_4_ + auVar80._0_4_ + auVar82._0_4_ + auVar81._0_4_;
  auVar215._4_4_ = auVar86._4_4_ + auVar80._4_4_ + auVar82._4_4_ + auVar81._4_4_;
  auVar215._8_4_ = auVar86._8_4_ + auVar80._8_4_ + auVar82._8_4_ + auVar81._8_4_;
  auVar215._12_4_ = auVar86._12_4_ + auVar80._12_4_ + auVar82._12_4_ + auVar81._12_4_;
  auVar87._8_4_ = 0x3e800000;
  auVar87._0_8_ = 0x3e8000003e800000;
  auVar87._12_4_ = 0x3e800000;
  auVar78 = vmulps_avx512vl(auVar215,auVar87);
  auVar78 = vsubps_avx(auVar78,auVar85);
  auVar78 = vdpps_avx(auVar78,local_710,0x7f);
  fVar203 = *(float *)(ray + k * 4 + 0x30);
  local_720 = vdpps_avx(local_710,local_710,0x7f);
  auVar220._4_12_ = ZEXT812(0) << 0x20;
  auVar220._0_4_ = local_720._0_4_;
  auVar79 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar220);
  auVar83 = vfnmadd213ss_fma(auVar79,local_720,ZEXT416(0x40000000));
  local_260 = auVar78._0_4_ * auVar79._0_4_ * auVar83._0_4_;
  auVar221._4_4_ = local_260;
  auVar221._0_4_ = local_260;
  auVar221._8_4_ = local_260;
  auVar221._12_4_ = local_260;
  fStack_6b0 = local_260;
  _local_6c0 = auVar221;
  fStack_6ac = local_260;
  fStack_6a8 = local_260;
  fStack_6a4 = local_260;
  auVar78 = vfmadd231ps_fma(auVar85,local_710,auVar221);
  auVar78 = vblendps_avx(auVar78,ZEXT816(0) << 0x40,8);
  auVar80 = vsubps_avx(auVar80,auVar78);
  auVar85 = vsubps_avx(auVar81,auVar78);
  auVar81 = vsubps_avx(auVar82,auVar78);
  auVar86 = vsubps_avx(auVar86,auVar78);
  uVar136 = auVar80._0_4_;
  local_8a0._4_4_ = uVar136;
  local_8a0._0_4_ = uVar136;
  local_8a0._8_4_ = uVar136;
  local_8a0._12_4_ = uVar136;
  local_8a0._16_4_ = uVar136;
  local_8a0._20_4_ = uVar136;
  local_8a0._24_4_ = uVar136;
  local_8a0._28_4_ = uVar136;
  auVar231 = ZEXT3264(local_8a0);
  auVar115._8_4_ = 1;
  auVar115._0_8_ = 0x100000001;
  auVar115._12_4_ = 1;
  auVar115._16_4_ = 1;
  auVar115._20_4_ = 1;
  auVar115._24_4_ = 1;
  auVar115._28_4_ = 1;
  local_580 = ZEXT1632(auVar80);
  local_880 = vpermps_avx2(auVar115,local_580);
  auVar232 = ZEXT3264(local_880);
  auVar116._8_4_ = 2;
  auVar116._0_8_ = 0x200000002;
  auVar116._12_4_ = 2;
  auVar116._16_4_ = 2;
  auVar116._20_4_ = 2;
  auVar116._24_4_ = 2;
  auVar116._28_4_ = 2;
  local_8c0 = vpermps_avx512vl(auVar116,local_580);
  auVar254 = ZEXT3264(local_8c0);
  auVar195._8_4_ = 3;
  auVar195._0_8_ = 0x300000003;
  auVar195._12_4_ = 3;
  auVar195._16_4_ = 3;
  auVar195._20_4_ = 3;
  auVar195._24_4_ = 3;
  auVar195._28_4_ = 3;
  local_7c0 = vpermps_avx2(auVar195,local_580);
  auVar240 = ZEXT3264(local_7c0);
  uVar136 = auVar81._0_4_;
  local_560._4_4_ = uVar136;
  local_560._0_4_ = uVar136;
  local_560._8_4_ = uVar136;
  local_560._12_4_ = uVar136;
  local_560._16_4_ = uVar136;
  local_560._20_4_ = uVar136;
  local_560._24_4_ = uVar136;
  local_560._28_4_ = uVar136;
  auVar227 = ZEXT3264(local_560);
  local_5c0 = ZEXT1632(auVar81);
  local_6e0 = vpermps_avx2(auVar115,local_5c0);
  local_8e0 = vpermps_avx512vl(auVar116,local_5c0);
  auVar256 = ZEXT3264(local_8e0);
  local_900 = vpermps_avx512vl(auVar195,local_5c0);
  auVar243 = ZEXT3264(local_900);
  local_920 = vbroadcastss_avx512vl(auVar85);
  auVar244 = ZEXT3264(local_920);
  local_5a0 = ZEXT1632(auVar85);
  local_940 = vpermps_avx512vl(auVar115,local_5a0);
  auVar245 = ZEXT3264(local_940);
  local_7e0 = vpermps_avx512vl(auVar116,local_5a0);
  auVar246 = ZEXT3264(local_7e0);
  local_960 = vpermps_avx512vl(auVar195,local_5a0);
  auVar247 = ZEXT3264(local_960);
  auVar214 = ZEXT3264(local_6e0);
  local_800 = vbroadcastss_avx512vl(auVar86);
  auVar248 = ZEXT3264(local_800);
  _local_5e0 = ZEXT1632(auVar86);
  local_980 = vpermps_avx512vl(auVar115,_local_5e0);
  auVar249 = ZEXT3264(local_980);
  local_820 = vpermps_avx512vl(auVar116,_local_5e0);
  auVar250 = ZEXT3264(local_820);
  local_9a0 = vpermps_avx512vl(auVar195,_local_5e0);
  auVar253 = ZEXT3264(local_9a0);
  auVar80 = vmulss_avx512f(auVar251,auVar251);
  auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),local_3c0,local_3c0);
  local_240 = vfmadd231ps_avx512vl(auVar93,local_3a0,local_3a0);
  uVar136 = local_240._0_4_;
  local_220._4_4_ = uVar136;
  local_220._0_4_ = uVar136;
  local_220._8_4_ = uVar136;
  local_220._12_4_ = uVar136;
  local_220._16_4_ = uVar136;
  local_220._20_4_ = uVar136;
  local_220._24_4_ = uVar136;
  local_220._28_4_ = uVar136;
  auVar112._8_4_ = 0x7fffffff;
  auVar112._0_8_ = 0x7fffffff7fffffff;
  auVar112._12_4_ = 0x7fffffff;
  auVar112._16_4_ = 0x7fffffff;
  auVar112._20_4_ = 0x7fffffff;
  auVar112._24_4_ = 0x7fffffff;
  auVar112._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar112);
  local_660 = ZEXT416((uint)local_260);
  local_260 = fVar203 - local_260;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_470 = vpbroadcastd_avx512vl();
  uVar66 = 0;
  local_9ac = 1;
  local_480 = vpbroadcastd_avx512vl();
  auVar80 = vsqrtss_avx(local_720,local_720);
  local_9a4 = auVar80._0_4_;
  auVar80 = vsqrtss_avx(local_720,local_720);
  local_9a8 = auVar80._0_4_;
  local_330 = ZEXT816(0x3f80000000000000);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar255 = ZEXT3264(auVar93);
  do {
    auVar80 = vmovshdup_avx(local_330);
    auVar80 = vsubps_avx(auVar80,local_330);
    fVar135 = auVar80._0_4_;
    fVar137 = fVar135 * 0.04761905;
    auVar206._0_4_ = local_330._0_4_;
    auVar206._4_4_ = auVar206._0_4_;
    auVar206._8_4_ = auVar206._0_4_;
    auVar206._12_4_ = auVar206._0_4_;
    auVar206._16_4_ = auVar206._0_4_;
    auVar206._20_4_ = auVar206._0_4_;
    auVar206._24_4_ = auVar206._0_4_;
    auVar206._28_4_ = auVar206._0_4_;
    local_7a0._4_4_ = fVar135;
    local_7a0._0_4_ = fVar135;
    local_7a0._8_4_ = fVar135;
    local_7a0._12_4_ = fVar135;
    local_7a0._16_4_ = fVar135;
    local_7a0._20_4_ = fVar135;
    local_7a0._24_4_ = fVar135;
    local_7a0._28_4_ = fVar135;
    auVar80 = vfmadd231ps_fma(auVar206,local_7a0,_DAT_01faff20);
    auVar111 = auVar255._0_32_;
    auVar93 = vsubps_avx512vl(auVar111,ZEXT1632(auVar80));
    fVar135 = auVar80._0_4_;
    fVar164 = auVar80._4_4_;
    auVar63._4_4_ = auVar227._4_4_ * fVar164;
    auVar63._0_4_ = auVar227._0_4_ * fVar135;
    fVar166 = auVar80._8_4_;
    auVar63._8_4_ = auVar227._8_4_ * fVar166;
    fVar168 = auVar80._12_4_;
    auVar63._12_4_ = auVar227._12_4_ * fVar168;
    auVar63._16_4_ = auVar227._16_4_ * 0.0;
    auVar63._20_4_ = auVar227._20_4_ * 0.0;
    auVar63._24_4_ = auVar227._24_4_ * 0.0;
    auVar63._28_4_ = DAT_01faff20._28_4_;
    auVar95 = ZEXT1632(auVar80);
    auVar42._4_4_ = auVar214._4_4_ * fVar164;
    auVar42._0_4_ = auVar214._0_4_ * fVar135;
    auVar42._8_4_ = auVar214._8_4_ * fVar166;
    auVar42._12_4_ = auVar214._12_4_ * fVar168;
    auVar42._16_4_ = auVar214._16_4_ * 0.0;
    auVar42._20_4_ = auVar214._20_4_ * 0.0;
    auVar42._24_4_ = auVar214._24_4_ * 0.0;
    auVar42._28_4_ = auVar206._0_4_;
    auVar91 = vmulps_avx512vl(auVar256._0_32_,auVar95);
    auVar94 = vmulps_avx512vl(auVar243._0_32_,auVar95);
    auVar86 = vfmadd231ps_fma(auVar63,auVar93,auVar231._0_32_);
    auVar78 = vfmadd231ps_fma(auVar42,auVar93,auVar232._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,auVar254._0_32_);
    auVar85 = vfmadd231ps_fma(auVar94,auVar93,auVar240._0_32_);
    auVar94 = vmulps_avx512vl(auVar244._0_32_,auVar95);
    auVar99 = ZEXT1632(auVar80);
    auVar95 = vmulps_avx512vl(auVar245._0_32_,auVar99);
    auVar96 = vmulps_avx512vl(auVar246._0_32_,auVar99);
    auVar92 = vmulps_avx512vl(auVar247._0_32_,auVar99);
    auVar81 = vfmadd231ps_fma(auVar94,auVar93,auVar227._0_32_);
    auVar82 = vfmadd231ps_fma(auVar95,auVar93,auVar214._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar256._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar92,auVar93,auVar243._0_32_);
    auVar96 = vmulps_avx512vl(auVar248._0_32_,auVar99);
    auVar92 = vmulps_avx512vl(auVar249._0_32_,auVar99);
    auVar97 = vmulps_avx512vl(auVar250._0_32_,auVar99);
    auVar98 = vmulps_avx512vl(auVar253._0_32_,auVar99);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar244._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,auVar245._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar246._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar247._0_32_);
    auVar242._0_28_ =
         ZEXT1628(CONCAT412(fVar168 * auVar81._12_4_,
                            CONCAT48(fVar166 * auVar81._8_4_,
                                     CONCAT44(fVar164 * auVar81._4_4_,fVar135 * auVar81._0_4_))));
    auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar82));
    auVar100 = vmulps_avx512vl(ZEXT1632(auVar80),auVar94);
    auVar90 = vmulps_avx512vl(ZEXT1632(auVar80),auVar95);
    auVar80 = vfmadd231ps_fma(auVar242._0_32_,auVar93,ZEXT1632(auVar86));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar78));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar93,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,ZEXT1632(auVar85));
    auVar225._0_4_ = auVar96._0_4_ * fVar135;
    auVar225._4_4_ = auVar96._4_4_ * fVar164;
    auVar225._8_4_ = auVar96._8_4_ * fVar166;
    auVar225._12_4_ = auVar96._12_4_ * fVar168;
    auVar225._16_4_ = auVar96._16_4_ * 0.0;
    auVar225._20_4_ = auVar96._20_4_ * 0.0;
    auVar225._24_4_ = auVar96._24_4_ * 0.0;
    auVar225._28_4_ = 0;
    auVar43._4_4_ = auVar92._4_4_ * fVar164;
    auVar43._0_4_ = auVar92._0_4_ * fVar135;
    auVar43._8_4_ = auVar92._8_4_ * fVar166;
    auVar43._12_4_ = auVar92._12_4_ * fVar168;
    auVar43._16_4_ = auVar92._16_4_ * 0.0;
    auVar43._20_4_ = auVar92._20_4_ * 0.0;
    auVar43._24_4_ = auVar92._24_4_ * 0.0;
    auVar43._28_4_ = auVar96._28_4_;
    auVar44._4_4_ = auVar97._4_4_ * fVar164;
    auVar44._0_4_ = auVar97._0_4_ * fVar135;
    auVar44._8_4_ = auVar97._8_4_ * fVar166;
    auVar44._12_4_ = auVar97._12_4_ * fVar168;
    auVar44._16_4_ = auVar97._16_4_ * 0.0;
    auVar44._20_4_ = auVar97._20_4_ * 0.0;
    auVar44._24_4_ = auVar97._24_4_ * 0.0;
    auVar44._28_4_ = auVar92._28_4_;
    auVar45._4_4_ = auVar98._4_4_ * fVar164;
    auVar45._0_4_ = auVar98._0_4_ * fVar135;
    auVar45._8_4_ = auVar98._8_4_ * fVar166;
    auVar45._12_4_ = auVar98._12_4_ * fVar168;
    auVar45._16_4_ = auVar98._16_4_ * 0.0;
    auVar45._20_4_ = auVar98._20_4_ * 0.0;
    auVar45._24_4_ = auVar98._24_4_ * 0.0;
    auVar45._28_4_ = auVar97._28_4_;
    auVar86 = vfmadd231ps_fma(auVar225,auVar93,ZEXT1632(auVar81));
    auVar78 = vfmadd231ps_fma(auVar43,auVar93,ZEXT1632(auVar82));
    auVar85 = vfmadd231ps_fma(auVar44,auVar93,auVar94);
    auVar81 = vfmadd231ps_fma(auVar45,auVar93,auVar95);
    auVar46._28_4_ = auVar91._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar168 * auVar86._12_4_,
                            CONCAT48(fVar166 * auVar86._8_4_,
                                     CONCAT44(fVar164 * auVar86._4_4_,fVar135 * auVar86._0_4_))));
    auVar82 = vfmadd231ps_fma(auVar46,auVar93,ZEXT1632(auVar80));
    auVar92 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar78._12_4_ * fVar168,
                                            CONCAT48(auVar78._8_4_ * fVar166,
                                                     CONCAT44(auVar78._4_4_ * fVar164,
                                                              auVar78._0_4_ * fVar135)))),auVar93,
                         auVar99);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar85._12_4_ * fVar168,
                                            CONCAT48(auVar85._8_4_ * fVar166,
                                                     CONCAT44(auVar85._4_4_ * fVar164,
                                                              auVar85._0_4_ * fVar135)))),auVar93,
                         auVar100);
    auVar91 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar81._12_4_ * fVar168,
                                            CONCAT48(auVar81._8_4_ * fVar166,
                                                     CONCAT44(auVar81._4_4_ * fVar164,
                                                              auVar81._0_4_ * fVar135)))),auVar90,
                         auVar93);
    auVar93 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar80));
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar78),auVar99);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar85),auVar100);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar81),auVar90);
    auVar238._0_4_ = fVar137 * auVar93._0_4_ * 3.0;
    auVar238._4_4_ = fVar137 * auVar93._4_4_ * 3.0;
    auVar238._8_4_ = fVar137 * auVar93._8_4_ * 3.0;
    auVar238._12_4_ = fVar137 * auVar93._12_4_ * 3.0;
    auVar238._16_4_ = fVar137 * auVar93._16_4_ * 3.0;
    auVar238._20_4_ = fVar137 * auVar93._20_4_ * 3.0;
    auVar238._24_4_ = fVar137 * auVar93._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    auVar239._0_4_ = fVar137 * auVar94._0_4_ * 3.0;
    auVar239._4_4_ = fVar137 * auVar94._4_4_ * 3.0;
    auVar239._8_4_ = fVar137 * auVar94._8_4_ * 3.0;
    auVar239._12_4_ = fVar137 * auVar94._12_4_ * 3.0;
    auVar239._16_4_ = fVar137 * auVar94._16_4_ * 3.0;
    auVar239._20_4_ = fVar137 * auVar94._20_4_ * 3.0;
    auVar239._24_4_ = fVar137 * auVar94._24_4_ * 3.0;
    auVar239._28_4_ = 0;
    auVar47._4_4_ = fVar137 * auVar95._4_4_ * 3.0;
    auVar47._0_4_ = fVar137 * auVar95._0_4_ * 3.0;
    auVar47._8_4_ = fVar137 * auVar95._8_4_ * 3.0;
    auVar47._12_4_ = fVar137 * auVar95._12_4_ * 3.0;
    auVar47._16_4_ = fVar137 * auVar95._16_4_ * 3.0;
    auVar47._20_4_ = fVar137 * auVar95._20_4_ * 3.0;
    auVar47._24_4_ = fVar137 * auVar95._24_4_ * 3.0;
    auVar47._28_4_ = auVar98._28_4_;
    fVar135 = auVar96._0_4_ * 3.0 * fVar137;
    fVar164 = auVar96._4_4_ * 3.0 * fVar137;
    auVar48._4_4_ = fVar164;
    auVar48._0_4_ = fVar135;
    fVar166 = auVar96._8_4_ * 3.0 * fVar137;
    auVar48._8_4_ = fVar166;
    fVar168 = auVar96._12_4_ * 3.0 * fVar137;
    auVar48._12_4_ = fVar168;
    fVar170 = auVar96._16_4_ * 3.0 * fVar137;
    auVar48._16_4_ = fVar170;
    fVar172 = auVar96._20_4_ * 3.0 * fVar137;
    auVar48._20_4_ = fVar172;
    fVar202 = auVar96._24_4_ * 3.0 * fVar137;
    auVar48._24_4_ = fVar202;
    auVar48._28_4_ = fVar137;
    auVar80 = vxorps_avx512vl(auVar256._0_16_,auVar256._0_16_);
    auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01feed00,ZEXT1632(auVar80));
    auVar99 = vpermt2ps_avx512vl(auVar92,_DAT_01feed00,ZEXT1632(auVar80));
    auVar94 = ZEXT1632(auVar80);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_01feed00,auVar94);
    auVar219._0_4_ = auVar91._0_4_ + fVar135;
    auVar219._4_4_ = auVar91._4_4_ + fVar164;
    auVar219._8_4_ = auVar91._8_4_ + fVar166;
    auVar219._12_4_ = auVar91._12_4_ + fVar168;
    auVar219._16_4_ = auVar91._16_4_ + fVar170;
    auVar219._20_4_ = auVar91._20_4_ + fVar172;
    auVar219._24_4_ = auVar91._24_4_ + fVar202;
    auVar219._28_4_ = auVar91._28_4_ + fVar137;
    auVar93 = vmaxps_avx(auVar91,auVar219);
    auVar90 = vminps_avx512vl(auVar91,auVar219);
    auVar101 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,auVar94);
    auVar102 = vpermt2ps_avx512vl(auVar238,_DAT_01feed00,auVar94);
    auVar88 = vpermt2ps_avx512vl(auVar239,_DAT_01feed00,auVar94);
    auVar112 = ZEXT1632(auVar80);
    auVar89 = vpermt2ps_avx512vl(auVar47,_DAT_01feed00,auVar112);
    auVar91 = vpermt2ps_avx512vl(auVar48,_DAT_01feed00,auVar112);
    auVar91 = vsubps_avx(auVar101,auVar91);
    auVar94 = vsubps_avx(auVar98,ZEXT1632(auVar82));
    auVar95 = vsubps_avx(auVar99,auVar92);
    auVar96 = vsubps_avx(auVar100,auVar97);
    auVar103 = vmulps_avx512vl(auVar95,auVar47);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar239,auVar96);
    auVar104 = vmulps_avx512vl(auVar96,auVar238);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar47,auVar94);
    auVar105 = vmulps_avx512vl(auVar94,auVar239);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar238,auVar95);
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar104 = vmulps_avx512vl(auVar96,auVar96);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,auVar95);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,auVar94);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar106 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar111);
    auVar105 = vfmadd132ps_avx512vl(auVar106,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar105);
    auVar106 = vmulps_avx512vl(auVar95,auVar89);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar88,auVar96);
    auVar107 = vmulps_avx512vl(auVar96,auVar102);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar89,auVar94);
    auVar108 = vmulps_avx512vl(auVar94,auVar88);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar102,auVar95);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vmulps_avx512vl(auVar106,auVar105);
    auVar103 = vmaxps_avx512vl(auVar103,auVar105);
    auVar103 = vsqrtps_avx512vl(auVar103);
    auVar105 = vmaxps_avx512vl(auVar91,auVar101);
    auVar93 = vmaxps_avx512vl(auVar93,auVar105);
    auVar105 = vaddps_avx512vl(auVar103,auVar93);
    auVar93 = vminps_avx(auVar91,auVar101);
    auVar93 = vminps_avx512vl(auVar90,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar103);
    auVar30._8_4_ = 0x3f800002;
    auVar30._0_8_ = 0x3f8000023f800002;
    auVar30._12_4_ = 0x3f800002;
    auVar30._16_4_ = 0x3f800002;
    auVar30._20_4_ = 0x3f800002;
    auVar30._24_4_ = 0x3f800002;
    auVar30._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar105,auVar30);
    auVar31._8_4_ = 0x3f7ffffc;
    auVar31._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar31._12_4_ = 0x3f7ffffc;
    auVar31._16_4_ = 0x3f7ffffc;
    auVar31._20_4_ = 0x3f7ffffc;
    auVar31._24_4_ = 0x3f7ffffc;
    auVar31._28_4_ = 0x3f7ffffc;
    local_760 = vmulps_avx512vl(auVar93,auVar31);
    auVar93 = vmulps_avx512vl(auVar91,auVar91);
    auVar91 = vrsqrt14ps_avx512vl(auVar104);
    auVar32._8_4_ = 0xbf000000;
    auVar32._0_8_ = 0xbf000000bf000000;
    auVar32._12_4_ = 0xbf000000;
    auVar32._16_4_ = 0xbf000000;
    auVar32._20_4_ = 0xbf000000;
    auVar32._24_4_ = 0xbf000000;
    auVar32._28_4_ = 0xbf000000;
    auVar90 = vmulps_avx512vl(auVar104,auVar32);
    fVar135 = auVar91._0_4_;
    fVar164 = auVar91._4_4_;
    fVar166 = auVar91._8_4_;
    fVar168 = auVar91._12_4_;
    fVar137 = auVar91._16_4_;
    fVar170 = auVar91._20_4_;
    fVar172 = auVar91._24_4_;
    auVar49._4_4_ = fVar164 * fVar164 * fVar164 * auVar90._4_4_;
    auVar49._0_4_ = fVar135 * fVar135 * fVar135 * auVar90._0_4_;
    auVar49._8_4_ = fVar166 * fVar166 * fVar166 * auVar90._8_4_;
    auVar49._12_4_ = fVar168 * fVar168 * fVar168 * auVar90._12_4_;
    auVar49._16_4_ = fVar137 * fVar137 * fVar137 * auVar90._16_4_;
    auVar49._20_4_ = fVar170 * fVar170 * fVar170 * auVar90._20_4_;
    auVar49._24_4_ = fVar172 * fVar172 * fVar172 * auVar90._24_4_;
    auVar49._28_4_ = auVar105._28_4_;
    auVar33._8_4_ = 0x3fc00000;
    auVar33._0_8_ = 0x3fc000003fc00000;
    auVar33._12_4_ = 0x3fc00000;
    auVar33._16_4_ = 0x3fc00000;
    auVar33._20_4_ = 0x3fc00000;
    auVar33._24_4_ = 0x3fc00000;
    auVar33._28_4_ = 0x3fc00000;
    auVar91 = vfmadd231ps_avx512vl(auVar49,auVar91,auVar33);
    auVar242 = ZEXT3264(auVar91);
    auVar90 = vmulps_avx512vl(auVar94,auVar91);
    auVar101 = vmulps_avx512vl(auVar95,auVar91);
    auVar103 = vmulps_avx512vl(auVar96,auVar91);
    auVar213 = ZEXT1632(auVar82);
    auVar104 = vsubps_avx512vl(auVar112,auVar213);
    auVar105 = vsubps_avx512vl(auVar112,auVar92);
    auVar106 = vsubps_avx512vl(auVar112,auVar97);
    auVar107 = vmulps_avx512vl(auVar252._0_32_,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_3c0,auVar105);
    auVar107 = vfmadd231ps_avx512vl(auVar107,local_3a0,auVar104);
    auVar108 = vmulps_avx512vl(auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,auVar105);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar104);
    auVar109 = vmulps_avx512vl(auVar252._0_32_,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar101,local_3c0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar90,local_3a0);
    auVar103 = vmulps_avx512vl(auVar106,auVar103);
    auVar101 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar101);
    auVar90 = vfmadd231ps_avx512vl(auVar101,auVar104,auVar90);
    auVar101 = vmulps_avx512vl(auVar109,auVar109);
    auVar103 = vsubps_avx512vl(local_220,auVar101);
    auVar110 = vmulps_avx512vl(auVar109,auVar90);
    auVar107 = vsubps_avx512vl(auVar107,auVar110);
    auVar107 = vaddps_avx512vl(auVar107,auVar107);
    auVar110 = vmulps_avx512vl(auVar90,auVar90);
    local_780 = vsubps_avx512vl(auVar108,auVar110);
    auVar93 = vsubps_avx512vl(local_780,auVar93);
    local_680 = vmulps_avx512vl(auVar107,auVar107);
    auVar34._8_4_ = 0x40800000;
    auVar34._0_8_ = 0x4080000040800000;
    auVar34._12_4_ = 0x40800000;
    auVar34._16_4_ = 0x40800000;
    auVar34._20_4_ = 0x40800000;
    auVar34._24_4_ = 0x40800000;
    auVar34._28_4_ = 0x40800000;
    _local_4c0 = vmulps_avx512vl(auVar103,auVar34);
    auVar108 = vmulps_avx512vl(_local_4c0,auVar93);
    auVar108 = vsubps_avx512vl(local_680,auVar108);
    uVar74 = vcmpps_avx512vl(auVar108,auVar112,5);
    bVar64 = (byte)uVar74;
    fVar135 = (float)local_6c0._0_4_;
    fVar164 = (float)local_6c0._4_4_;
    fVar166 = fStack_6b8;
    fVar168 = fStack_6b4;
    fVar137 = fStack_6b0;
    fVar170 = fStack_6ac;
    fVar172 = fStack_6a8;
    fVar202 = fStack_6a4;
    if (bVar64 == 0) {
LAB_01cda77f:
      auVar252 = ZEXT3264(local_700);
      auVar231 = ZEXT3264(local_8a0);
      auVar232 = ZEXT3264(local_880);
      auVar254 = ZEXT3264(local_8c0);
      auVar240 = ZEXT3264(local_7c0);
      auVar227 = ZEXT3264(local_560);
      auVar214 = ZEXT3264(local_6e0);
      auVar256 = ZEXT3264(local_8e0);
      auVar243 = ZEXT3264(local_900);
      auVar244 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_940);
      auVar246 = ZEXT3264(local_7e0);
      auVar247 = ZEXT3264(local_960);
      auVar248 = ZEXT3264(local_800);
      auVar249 = ZEXT3264(local_980);
      auVar250 = ZEXT3264(local_820);
      auVar253 = ZEXT3264(local_9a0);
    }
    else {
      auVar108 = vsqrtps_avx512vl(auVar108);
      auVar110 = vaddps_avx512vl(auVar103,auVar103);
      local_540 = vrcp14ps_avx512vl(auVar110);
      auVar111 = vfnmadd213ps_avx512vl(local_540,auVar110,auVar111);
      auVar111 = vfmadd132ps_avx512vl(auVar111,local_540,local_540);
      auVar35._8_4_ = 0x80000000;
      auVar35._0_8_ = 0x8000000080000000;
      auVar35._12_4_ = 0x80000000;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      local_6a0 = vxorps_avx512vl(auVar107,auVar35);
      auVar112 = vsubps_avx512vl(local_6a0,auVar108);
      local_4e0 = vmulps_avx512vl(auVar112,auVar111);
      auVar108 = vsubps_avx512vl(auVar108,auVar107);
      local_740 = vmulps_avx512vl(auVar108,auVar111);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar111 = vblendmps_avx512vl(auVar108,local_4e0);
      auVar113._0_4_ =
           (uint)(bVar64 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar108._0_4_;
      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar8 * auVar111._4_4_ | (uint)!bVar8 * auVar108._4_4_;
      bVar8 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar8 * auVar111._8_4_ | (uint)!bVar8 * auVar108._8_4_;
      bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar8 * auVar111._12_4_ | (uint)!bVar8 * auVar108._12_4_;
      bVar8 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar8 * auVar111._16_4_ | (uint)!bVar8 * auVar108._16_4_;
      bVar8 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar8 * auVar111._20_4_ | (uint)!bVar8 * auVar108._20_4_;
      bVar8 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar8 * auVar111._24_4_ | (uint)!bVar8 * auVar108._24_4_;
      bVar8 = SUB81(uVar74 >> 7,0);
      auVar113._28_4_ = (uint)bVar8 * auVar111._28_4_ | (uint)!bVar8 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar111 = vblendmps_avx512vl(auVar108,local_740);
      auVar114._0_4_ =
           (uint)(bVar64 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar108._0_4_;
      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
      auVar114._4_4_ = (uint)bVar8 * auVar111._4_4_ | (uint)!bVar8 * auVar108._4_4_;
      bVar8 = (bool)((byte)(uVar74 >> 2) & 1);
      auVar114._8_4_ = (uint)bVar8 * auVar111._8_4_ | (uint)!bVar8 * auVar108._8_4_;
      bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
      auVar114._12_4_ = (uint)bVar8 * auVar111._12_4_ | (uint)!bVar8 * auVar108._12_4_;
      bVar8 = (bool)((byte)(uVar74 >> 4) & 1);
      auVar114._16_4_ = (uint)bVar8 * auVar111._16_4_ | (uint)!bVar8 * auVar108._16_4_;
      bVar8 = (bool)((byte)(uVar74 >> 5) & 1);
      auVar114._20_4_ = (uint)bVar8 * auVar111._20_4_ | (uint)!bVar8 * auVar108._20_4_;
      bVar8 = (bool)((byte)(uVar74 >> 6) & 1);
      auVar114._24_4_ = (uint)bVar8 * auVar111._24_4_ | (uint)!bVar8 * auVar108._24_4_;
      bVar8 = SUB81(uVar74 >> 7,0);
      auVar114._28_4_ = (uint)bVar8 * auVar111._28_4_ | (uint)!bVar8 * auVar108._28_4_;
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar101,auVar108);
      local_500 = vmaxps_avx512vl(local_240,auVar108);
      auVar36._8_4_ = 0x36000000;
      auVar36._0_8_ = 0x3600000036000000;
      auVar36._12_4_ = 0x36000000;
      auVar36._16_4_ = 0x36000000;
      auVar36._20_4_ = 0x36000000;
      auVar36._24_4_ = 0x36000000;
      auVar36._28_4_ = 0x36000000;
      local_520 = vmulps_avx512vl(local_500,auVar36);
      vandps_avx512vl(auVar103,auVar108);
      uVar75 = vcmpps_avx512vl(local_520,local_520,1);
      uVar74 = uVar74 & uVar75;
      bVar67 = (byte)uVar74;
      if (bVar67 != 0) {
        uVar75 = vcmpps_avx512vl(auVar93,_DAT_01faff00,2);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar103 = vblendmps_avx512vl(auVar93,auVar101);
        bVar70 = (byte)uVar75;
        uVar77 = (uint)(bVar70 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar70 & 1) * local_520._0_4_;
        bVar8 = (bool)((byte)(uVar75 >> 1) & 1);
        uVar76 = (uint)bVar8 * auVar103._4_4_ | (uint)!bVar8 * local_520._4_4_;
        bVar8 = (bool)((byte)(uVar75 >> 2) & 1);
        uVar128 = (uint)bVar8 * auVar103._8_4_ | (uint)!bVar8 * local_520._8_4_;
        bVar8 = (bool)((byte)(uVar75 >> 3) & 1);
        uVar129 = (uint)bVar8 * auVar103._12_4_ | (uint)!bVar8 * local_520._12_4_;
        bVar8 = (bool)((byte)(uVar75 >> 4) & 1);
        uVar130 = (uint)bVar8 * auVar103._16_4_ | (uint)!bVar8 * local_520._16_4_;
        bVar8 = (bool)((byte)(uVar75 >> 5) & 1);
        uVar131 = (uint)bVar8 * auVar103._20_4_ | (uint)!bVar8 * local_520._20_4_;
        bVar8 = (bool)((byte)(uVar75 >> 6) & 1);
        uVar132 = (uint)bVar8 * auVar103._24_4_ | (uint)!bVar8 * local_520._24_4_;
        bVar8 = SUB81(uVar75 >> 7,0);
        uVar133 = (uint)bVar8 * auVar103._28_4_ | (uint)!bVar8 * local_520._28_4_;
        auVar113._0_4_ = (bVar67 & 1) * uVar77 | !(bool)(bVar67 & 1) * auVar113._0_4_;
        bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar113._4_4_ = bVar8 * uVar76 | !bVar8 * auVar113._4_4_;
        bVar8 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar113._8_4_ = bVar8 * uVar128 | !bVar8 * auVar113._8_4_;
        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar113._12_4_ = bVar8 * uVar129 | !bVar8 * auVar113._12_4_;
        bVar8 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar113._16_4_ = bVar8 * uVar130 | !bVar8 * auVar113._16_4_;
        bVar8 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar113._20_4_ = bVar8 * uVar131 | !bVar8 * auVar113._20_4_;
        bVar8 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar113._24_4_ = bVar8 * uVar132 | !bVar8 * auVar113._24_4_;
        bVar8 = SUB81(uVar74 >> 7,0);
        auVar113._28_4_ = bVar8 * uVar133 | !bVar8 * auVar113._28_4_;
        auVar93 = vblendmps_avx512vl(auVar101,auVar93);
        bVar8 = (bool)((byte)(uVar75 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar75 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar75 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar75 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar75 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar75 >> 6) & 1);
        bVar15 = SUB81(uVar75 >> 7,0);
        auVar114._0_4_ =
             (uint)(bVar67 & 1) *
             ((uint)(bVar70 & 1) * auVar93._0_4_ | !(bool)(bVar70 & 1) * uVar77) |
             !(bool)(bVar67 & 1) * auVar114._0_4_;
        bVar9 = (bool)((byte)(uVar74 >> 1) & 1);
        auVar114._4_4_ =
             (uint)bVar9 * ((uint)bVar8 * auVar93._4_4_ | !bVar8 * uVar76) | !bVar9 * auVar114._4_4_
        ;
        bVar8 = (bool)((byte)(uVar74 >> 2) & 1);
        auVar114._8_4_ =
             (uint)bVar8 * ((uint)bVar10 * auVar93._8_4_ | !bVar10 * uVar128) |
             !bVar8 * auVar114._8_4_;
        bVar8 = (bool)((byte)(uVar74 >> 3) & 1);
        auVar114._12_4_ =
             (uint)bVar8 * ((uint)bVar11 * auVar93._12_4_ | !bVar11 * uVar129) |
             !bVar8 * auVar114._12_4_;
        bVar8 = (bool)((byte)(uVar74 >> 4) & 1);
        auVar114._16_4_ =
             (uint)bVar8 * ((uint)bVar12 * auVar93._16_4_ | !bVar12 * uVar130) |
             !bVar8 * auVar114._16_4_;
        bVar8 = (bool)((byte)(uVar74 >> 5) & 1);
        auVar114._20_4_ =
             (uint)bVar8 * ((uint)bVar13 * auVar93._20_4_ | !bVar13 * uVar131) |
             !bVar8 * auVar114._20_4_;
        bVar8 = (bool)((byte)(uVar74 >> 6) & 1);
        auVar114._24_4_ =
             (uint)bVar8 * ((uint)bVar14 * auVar93._24_4_ | !bVar14 * uVar132) |
             !bVar8 * auVar114._24_4_;
        bVar8 = SUB81(uVar74 >> 7,0);
        auVar114._28_4_ =
             (uint)bVar8 * ((uint)bVar15 * auVar93._28_4_ | !bVar15 * uVar133) |
             !bVar8 * auVar114._28_4_;
        bVar64 = (~bVar67 | bVar70) & bVar64;
      }
      if ((bVar64 & 0x7f) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar93);
        goto LAB_01cda77f;
      }
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = vxorps_avx512vl(auVar89,auVar93);
      auVar102 = vxorps_avx512vl(auVar102,auVar93);
      uVar77 = *(uint *)(ray + k * 4 + 0x80);
      auVar88 = vxorps_avx512vl(auVar88,auVar93);
      auVar80 = vsubss_avx512f(ZEXT416(uVar77),ZEXT416((uint)local_660._0_4_));
      auVar89 = vbroadcastss_avx512vl(auVar80);
      auVar89 = vminps_avx512vl(auVar89,auVar114);
      auVar62._4_4_ = fStack_25c;
      auVar62._0_4_ = local_260;
      auVar62._8_4_ = fStack_258;
      auVar62._12_4_ = fStack_254;
      auVar62._16_4_ = fStack_250;
      auVar62._20_4_ = fStack_24c;
      auVar62._24_4_ = fStack_248;
      auVar62._28_4_ = fStack_244;
      auVar103 = vmaxps_avx512vl(auVar62,auVar113);
      auVar106 = vmulps_avx512vl(auVar106,auVar47);
      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar239,auVar106);
      auVar80 = vfmadd213ps_fma(auVar104,auVar238,auVar105);
      auVar104 = vmulps_avx512vl(local_700,auVar47);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar239);
      auVar104 = vfmadd231ps_avx512vl(auVar104,local_3a0,auVar238);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar104,auVar105);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar105,auVar106,1);
      auVar108 = vxorps_avx512vl(ZEXT1632(auVar80),auVar93);
      auVar111 = vrcp14ps_avx512vl(auVar104);
      auVar112 = vxorps_avx512vl(auVar104,auVar93);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar116 = vfnmadd213ps_avx512vl(auVar111,auVar104,auVar115);
      auVar80 = vfmadd132ps_fma(auVar116,auVar111,auVar111);
      fVar150 = auVar80._0_4_ * auVar108._0_4_;
      fVar165 = auVar80._4_4_ * auVar108._4_4_;
      auVar50._4_4_ = fVar165;
      auVar50._0_4_ = fVar150;
      fVar167 = auVar80._8_4_ * auVar108._8_4_;
      auVar50._8_4_ = fVar167;
      fVar169 = auVar80._12_4_ * auVar108._12_4_;
      auVar50._12_4_ = fVar169;
      fVar171 = auVar108._16_4_ * 0.0;
      auVar50._16_4_ = fVar171;
      fVar173 = auVar108._20_4_ * 0.0;
      auVar50._20_4_ = fVar173;
      fVar174 = auVar108._24_4_ * 0.0;
      auVar50._24_4_ = fVar174;
      auVar50._28_4_ = auVar108._28_4_;
      uVar18 = vcmpps_avx512vl(auVar104,auVar112,1);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar229._8_4_ = 0xff800000;
      auVar229._0_8_ = 0xff800000ff800000;
      auVar229._12_4_ = 0xff800000;
      auVar229._16_4_ = 0xff800000;
      auVar229._20_4_ = 0xff800000;
      auVar229._24_4_ = 0xff800000;
      auVar229._28_4_ = 0xff800000;
      auVar116 = vblendmps_avx512vl(auVar50,auVar229);
      auVar117._0_4_ =
           (uint)(bVar67 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar111._0_4_;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar8 * auVar116._4_4_ | (uint)!bVar8 * auVar111._4_4_;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar8 * auVar116._8_4_ | (uint)!bVar8 * auVar111._8_4_;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar8 * auVar116._12_4_ | (uint)!bVar8 * auVar111._12_4_;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar8 * auVar116._16_4_ | (uint)!bVar8 * auVar111._16_4_;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar8 * auVar116._20_4_ | (uint)!bVar8 * auVar111._20_4_;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar8 * auVar116._24_4_ | (uint)!bVar8 * auVar111._24_4_;
      auVar117._28_4_ =
           (uint)(bVar67 >> 7) * auVar116._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar111._28_4_;
      auVar111 = vmaxps_avx512vl(auVar103,auVar117);
      uVar18 = vcmpps_avx512vl(auVar104,auVar112,6);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar118._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar150;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar165;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar167;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar169;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar171;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar173;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar174;
      auVar118._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar108._28_4_;
      auVar89 = vminps_avx512vl(auVar89,auVar118);
      auVar80 = vxorps_avx512vl(auVar103._0_16_,auVar103._0_16_);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar80),auVar98);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar80),auVar99);
      auVar103 = ZEXT1632(auVar80);
      auVar100 = vsubps_avx512vl(auVar103,auVar100);
      auVar100 = vmulps_avx512vl(auVar100,auVar101);
      auVar99 = vfmadd231ps_avx512vl(auVar100,auVar88,auVar99);
      auVar98 = vfmadd231ps_avx512vl(auVar99,auVar102,auVar98);
      auVar99 = vmulps_avx512vl(local_700,auVar101);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_3c0,auVar88);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_3a0,auVar102);
      vandps_avx512vl(auVar99,auVar105);
      uVar16 = vcmpps_avx512vl(auVar99,auVar106,1);
      auVar98 = vxorps_avx512vl(auVar98,auVar93);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar93 = vxorps_avx512vl(auVar99,auVar93);
      auVar101 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar115);
      auVar80 = vfmadd132ps_fma(auVar101,auVar100,auVar100);
      fVar150 = auVar80._0_4_ * auVar98._0_4_;
      fVar165 = auVar80._4_4_ * auVar98._4_4_;
      auVar51._4_4_ = fVar165;
      auVar51._0_4_ = fVar150;
      fVar167 = auVar80._8_4_ * auVar98._8_4_;
      auVar51._8_4_ = fVar167;
      fVar169 = auVar80._12_4_ * auVar98._12_4_;
      auVar51._12_4_ = fVar169;
      fVar171 = auVar98._16_4_ * 0.0;
      auVar51._16_4_ = fVar171;
      fVar173 = auVar98._20_4_ * 0.0;
      auVar51._20_4_ = fVar173;
      fVar174 = auVar98._24_4_ * 0.0;
      auVar51._24_4_ = fVar174;
      auVar51._28_4_ = auVar98._28_4_;
      uVar18 = vcmpps_avx512vl(auVar99,auVar93,1);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar101 = vblendmps_avx512vl(auVar51,auVar229);
      auVar119._0_4_ =
           (uint)(bVar67 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar100._0_4_;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar8 * auVar101._4_4_ | (uint)!bVar8 * auVar100._4_4_;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar8 * auVar101._8_4_ | (uint)!bVar8 * auVar100._8_4_;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar8 * auVar101._12_4_ | (uint)!bVar8 * auVar100._12_4_;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar8 * auVar101._16_4_ | (uint)!bVar8 * auVar100._16_4_;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar8 * auVar101._20_4_ | (uint)!bVar8 * auVar100._20_4_;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar8 * auVar101._24_4_ | (uint)!bVar8 * auVar100._24_4_;
      auVar119._28_4_ =
           (uint)(bVar67 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar100._28_4_;
      _local_600 = vmaxps_avx(auVar111,auVar119);
      uVar18 = vcmpps_avx512vl(auVar99,auVar93,6);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar120._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar150;
      bVar8 = (bool)(bVar67 >> 1 & 1);
      auVar120._4_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar165;
      bVar8 = (bool)(bVar67 >> 2 & 1);
      auVar120._8_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar167;
      bVar8 = (bool)(bVar67 >> 3 & 1);
      auVar120._12_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar169;
      bVar8 = (bool)(bVar67 >> 4 & 1);
      auVar120._16_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar171;
      bVar8 = (bool)(bVar67 >> 5 & 1);
      auVar120._20_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar173;
      bVar8 = (bool)(bVar67 >> 6 & 1);
      auVar120._24_4_ = (uint)bVar8 * 0x7f800000 | (uint)!bVar8 * (int)fVar174;
      auVar120._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar98._28_4_;
      local_2e0 = vminps_avx(auVar89,auVar120);
      uVar16 = vcmpps_avx512vl(_local_600,local_2e0,2);
      bVar64 = bVar64 & 0x7f & (byte)uVar16;
      if (bVar64 == 0) {
        auVar255 = ZEXT3264(auVar115);
        goto LAB_01cda77f;
      }
      auVar98 = vmaxps_avx512vl(auVar103,local_760);
      auVar93 = vfmadd213ps_avx512vl(local_4e0,auVar109,auVar90);
      fVar150 = auVar91._0_4_;
      fVar165 = auVar91._4_4_;
      auVar52._4_4_ = fVar165 * auVar93._4_4_;
      auVar52._0_4_ = fVar150 * auVar93._0_4_;
      fVar167 = auVar91._8_4_;
      auVar52._8_4_ = fVar167 * auVar93._8_4_;
      fVar169 = auVar91._12_4_;
      auVar52._12_4_ = fVar169 * auVar93._12_4_;
      fVar171 = auVar91._16_4_;
      auVar52._16_4_ = fVar171 * auVar93._16_4_;
      fVar173 = auVar91._20_4_;
      auVar52._20_4_ = fVar173 * auVar93._20_4_;
      fVar174 = auVar91._24_4_;
      auVar52._24_4_ = fVar174 * auVar93._24_4_;
      auVar52._28_4_ = auVar93._28_4_;
      auVar93 = vfmadd213ps_avx512vl(local_740,auVar109,auVar90);
      auVar53._4_4_ = fVar165 * auVar93._4_4_;
      auVar53._0_4_ = fVar150 * auVar93._0_4_;
      auVar53._8_4_ = fVar167 * auVar93._8_4_;
      auVar53._12_4_ = fVar169 * auVar93._12_4_;
      auVar53._16_4_ = fVar171 * auVar93._16_4_;
      auVar53._20_4_ = fVar173 * auVar93._20_4_;
      auVar53._24_4_ = fVar174 * auVar93._24_4_;
      auVar53._28_4_ = auVar119._28_4_;
      auVar93 = vminps_avx512vl(auVar52,auVar115);
      auVar59 = ZEXT812(0);
      auVar99 = ZEXT1232(auVar59) << 0x20;
      auVar93 = vmaxps_avx(auVar93,ZEXT1232(auVar59) << 0x20);
      auVar100 = vminps_avx512vl(auVar53,auVar115);
      auVar54._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
      auVar54._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
      auVar54._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
      auVar54._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
      auVar54._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
      auVar54._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
      auVar54._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
      auVar54._28_4_ = auVar93._28_4_ + 7.0;
      auVar80 = vfmadd213ps_fma(auVar54,local_7a0,auVar206);
      local_1a0 = ZEXT1632(auVar80);
      auVar93 = vmaxps_avx(auVar100,ZEXT1232(auVar59) << 0x20);
      auVar55._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
      auVar55._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
      auVar55._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
      auVar55._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
      auVar55._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
      auVar55._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
      auVar55._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
      auVar55._28_4_ = auVar93._28_4_ + 7.0;
      auVar80 = vfmadd213ps_fma(auVar55,local_7a0,auVar206);
      local_1c0 = ZEXT1632(auVar80);
      auVar56._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar56._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar56._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar56._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar56._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar56._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar56._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar56._28_4_ = auVar98._28_4_;
      auVar93 = vsubps_avx(local_780,auVar56);
      auVar57._4_4_ = auVar93._4_4_ * (float)local_4c0._4_4_;
      auVar57._0_4_ = auVar93._0_4_ * (float)local_4c0._0_4_;
      auVar57._8_4_ = auVar93._8_4_ * fStack_4b8;
      auVar57._12_4_ = auVar93._12_4_ * fStack_4b4;
      auVar57._16_4_ = auVar93._16_4_ * fStack_4b0;
      auVar57._20_4_ = auVar93._20_4_ * fStack_4ac;
      auVar57._24_4_ = auVar93._24_4_ * fStack_4a8;
      auVar57._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(local_680,auVar57);
      uVar74 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar59) << 0x20,5);
      auVar250 = ZEXT3264(local_820);
      if ((byte)uVar74 == 0) {
        uVar74 = 0;
        auVar91 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar101 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar121._8_4_ = 0x7f800000;
        auVar121._0_8_ = 0x7f8000007f800000;
        auVar121._12_4_ = 0x7f800000;
        auVar121._16_4_ = 0x7f800000;
        auVar121._20_4_ = 0x7f800000;
        auVar121._24_4_ = 0x7f800000;
        auVar121._28_4_ = 0x7f800000;
        auVar122._8_4_ = 0xff800000;
        auVar122._0_8_ = 0xff800000ff800000;
        auVar122._12_4_ = 0xff800000;
        auVar122._16_4_ = 0xff800000;
        auVar122._20_4_ = 0xff800000;
        auVar122._24_4_ = 0xff800000;
        auVar122._28_4_ = 0xff800000;
      }
      else {
        uVar75 = vcmpps_avx512vl(auVar98,auVar103,5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar99 = vfnmadd213ps_avx512vl(auVar110,local_540,auVar115);
        auVar101 = vfmadd132ps_avx512vl(auVar99,local_540,local_540);
        auVar99 = vsubps_avx(local_6a0,auVar98);
        auVar102 = vmulps_avx512vl(auVar99,auVar101);
        auVar98 = vsubps_avx512vl(auVar98,auVar107);
        auVar88 = vmulps_avx512vl(auVar98,auVar101);
        auVar98 = vfmadd213ps_avx512vl(auVar109,auVar102,auVar90);
        auVar58._4_4_ = fVar165 * auVar98._4_4_;
        auVar58._0_4_ = fVar150 * auVar98._0_4_;
        auVar58._8_4_ = fVar167 * auVar98._8_4_;
        auVar58._12_4_ = fVar169 * auVar98._12_4_;
        auVar58._16_4_ = fVar171 * auVar98._16_4_;
        auVar58._20_4_ = fVar173 * auVar98._20_4_;
        auVar58._24_4_ = fVar174 * auVar98._24_4_;
        auVar58._28_4_ = auVar100._28_4_;
        auVar98 = vmulps_avx512vl(local_3a0,auVar102);
        auVar99 = vmulps_avx512vl(local_3c0,auVar102);
        auVar89 = vmulps_avx512vl(local_700,auVar102);
        auVar100 = vfmadd213ps_avx512vl(auVar94,auVar58,auVar213);
        auVar100 = vsubps_avx512vl(auVar98,auVar100);
        auVar98 = vfmadd213ps_avx512vl(auVar95,auVar58,auVar92);
        auVar101 = vsubps_avx512vl(auVar99,auVar98);
        auVar80 = vfmadd213ps_fma(auVar58,auVar96,auVar97);
        auVar98 = vsubps_avx(auVar89,ZEXT1632(auVar80));
        auVar99 = vfmadd213ps_avx512vl(auVar109,auVar88,auVar90);
        auVar90 = vmulps_avx512vl(auVar91,auVar99);
        auVar242 = ZEXT3264(auVar90);
        auVar91 = vmulps_avx512vl(local_3a0,auVar88);
        auVar89 = vmulps_avx512vl(local_3c0,auVar88);
        auVar103 = vmulps_avx512vl(local_700,auVar88);
        auVar80 = vfmadd213ps_fma(auVar94,auVar90,auVar213);
        auVar99 = vsubps_avx(auVar91,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar95,auVar90,auVar92);
        auVar91 = vsubps_avx512vl(auVar89,ZEXT1632(auVar80));
        auVar80 = vfmadd213ps_fma(auVar96,auVar90,auVar97);
        auVar94 = vsubps_avx512vl(auVar103,ZEXT1632(auVar80));
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar95 = vblendmps_avx512vl(auVar196,auVar102);
        bVar8 = (bool)((byte)uVar75 & 1);
        auVar121._0_4_ = (uint)bVar8 * auVar95._0_4_ | (uint)!bVar8 * auVar82._0_4_;
        bVar8 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * auVar82._4_4_;
        bVar8 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * auVar82._8_4_;
        bVar8 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * auVar82._12_4_;
        iVar1 = (uint)((byte)(uVar75 >> 4) & 1) * auVar95._16_4_;
        auVar121._16_4_ = iVar1;
        iVar2 = (uint)((byte)(uVar75 >> 5) & 1) * auVar95._20_4_;
        auVar121._20_4_ = iVar2;
        iVar3 = (uint)((byte)(uVar75 >> 6) & 1) * auVar95._24_4_;
        auVar121._24_4_ = iVar3;
        iVar4 = (uint)(byte)(uVar75 >> 7) * auVar95._28_4_;
        auVar121._28_4_ = iVar4;
        auVar197._8_4_ = 0xff800000;
        auVar197._0_8_ = 0xff800000ff800000;
        auVar197._12_4_ = 0xff800000;
        auVar197._16_4_ = 0xff800000;
        auVar197._20_4_ = 0xff800000;
        auVar197._24_4_ = 0xff800000;
        auVar197._28_4_ = 0xff800000;
        auVar95 = vblendmps_avx512vl(auVar197,auVar88);
        bVar8 = (bool)((byte)uVar75 & 1);
        auVar122._0_4_ = (uint)bVar8 * auVar95._0_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar75 >> 1) & 1);
        auVar122._4_4_ = (uint)bVar8 * auVar95._4_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar75 >> 2) & 1);
        auVar122._8_4_ = (uint)bVar8 * auVar95._8_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar75 >> 3) & 1);
        auVar122._12_4_ = (uint)bVar8 * auVar95._12_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar75 >> 4) & 1);
        auVar122._16_4_ = (uint)bVar8 * auVar95._16_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar75 >> 5) & 1);
        auVar122._20_4_ = (uint)bVar8 * auVar95._20_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = (bool)((byte)(uVar75 >> 6) & 1);
        auVar122._24_4_ = (uint)bVar8 * auVar95._24_4_ | (uint)!bVar8 * -0x800000;
        bVar8 = SUB81(uVar75 >> 7,0);
        auVar122._28_4_ = (uint)bVar8 * auVar95._28_4_ | (uint)!bVar8 * -0x800000;
        auVar37._8_4_ = 0x36000000;
        auVar37._0_8_ = 0x3600000036000000;
        auVar37._12_4_ = 0x36000000;
        auVar37._16_4_ = 0x36000000;
        auVar37._20_4_ = 0x36000000;
        auVar37._24_4_ = 0x36000000;
        auVar37._28_4_ = 0x36000000;
        auVar95 = vmulps_avx512vl(local_500,auVar37);
        uVar17 = vcmpps_avx512vl(auVar95,local_520,0xe);
        uVar75 = uVar75 & uVar17;
        bVar67 = (byte)uVar75;
        if (bVar67 != 0) {
          uVar17 = vcmpps_avx512vl(auVar93,ZEXT1632(ZEXT816(0) << 0x40),2);
          auVar228._8_4_ = 0x7f800000;
          auVar228._0_8_ = 0x7f8000007f800000;
          auVar228._12_4_ = 0x7f800000;
          auVar228._16_4_ = 0x7f800000;
          auVar228._20_4_ = 0x7f800000;
          auVar228._24_4_ = 0x7f800000;
          auVar228._28_4_ = 0x7f800000;
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          auVar93 = vblendmps_avx512vl(auVar228,auVar230);
          bVar70 = (byte)uVar17;
          uVar76 = (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar95._0_4_;
          bVar8 = (bool)((byte)(uVar17 >> 1) & 1);
          uVar128 = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * auVar95._4_4_;
          bVar8 = (bool)((byte)(uVar17 >> 2) & 1);
          uVar129 = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * auVar95._8_4_;
          bVar8 = (bool)((byte)(uVar17 >> 3) & 1);
          uVar130 = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * auVar95._12_4_;
          bVar8 = (bool)((byte)(uVar17 >> 4) & 1);
          uVar131 = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * auVar95._16_4_;
          bVar8 = (bool)((byte)(uVar17 >> 5) & 1);
          uVar132 = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * auVar95._20_4_;
          bVar8 = (bool)((byte)(uVar17 >> 6) & 1);
          uVar133 = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * auVar95._24_4_;
          bVar8 = SUB81(uVar17 >> 7,0);
          uVar134 = (uint)bVar8 * auVar93._28_4_ | (uint)!bVar8 * auVar95._28_4_;
          auVar121._0_4_ = (bVar67 & 1) * uVar76 | !(bool)(bVar67 & 1) * auVar121._0_4_;
          bVar8 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar121._4_4_ = bVar8 * uVar128 | !bVar8 * auVar121._4_4_;
          bVar8 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar121._8_4_ = bVar8 * uVar129 | !bVar8 * auVar121._8_4_;
          bVar8 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar121._12_4_ = bVar8 * uVar130 | !bVar8 * auVar121._12_4_;
          bVar8 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar121._16_4_ = bVar8 * uVar131 | (uint)!bVar8 * iVar1;
          bVar8 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar121._20_4_ = bVar8 * uVar132 | (uint)!bVar8 * iVar2;
          bVar8 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar121._24_4_ = bVar8 * uVar133 | (uint)!bVar8 * iVar3;
          bVar8 = SUB81(uVar75 >> 7,0);
          auVar121._28_4_ = bVar8 * uVar134 | (uint)!bVar8 * iVar4;
          auVar93 = vblendmps_avx512vl(auVar230,auVar228);
          bVar8 = (bool)((byte)(uVar17 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar17 >> 2) & 1);
          bVar11 = (bool)((byte)(uVar17 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar17 >> 4) & 1);
          bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
          bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
          bVar15 = SUB81(uVar17 >> 7,0);
          auVar122._0_4_ =
               (uint)(bVar67 & 1) *
               ((uint)(bVar70 & 1) * auVar93._0_4_ | !(bool)(bVar70 & 1) * uVar76) |
               !(bool)(bVar67 & 1) * auVar122._0_4_;
          bVar9 = (bool)((byte)(uVar75 >> 1) & 1);
          auVar122._4_4_ =
               (uint)bVar9 * ((uint)bVar8 * auVar93._4_4_ | !bVar8 * uVar128) |
               !bVar9 * auVar122._4_4_;
          bVar8 = (bool)((byte)(uVar75 >> 2) & 1);
          auVar122._8_4_ =
               (uint)bVar8 * ((uint)bVar10 * auVar93._8_4_ | !bVar10 * uVar129) |
               !bVar8 * auVar122._8_4_;
          bVar8 = (bool)((byte)(uVar75 >> 3) & 1);
          auVar122._12_4_ =
               (uint)bVar8 * ((uint)bVar11 * auVar93._12_4_ | !bVar11 * uVar130) |
               !bVar8 * auVar122._12_4_;
          bVar8 = (bool)((byte)(uVar75 >> 4) & 1);
          auVar122._16_4_ =
               (uint)bVar8 * ((uint)bVar12 * auVar93._16_4_ | !bVar12 * uVar131) |
               !bVar8 * auVar122._16_4_;
          bVar8 = (bool)((byte)(uVar75 >> 5) & 1);
          auVar122._20_4_ =
               (uint)bVar8 * ((uint)bVar13 * auVar93._20_4_ | !bVar13 * uVar132) |
               !bVar8 * auVar122._20_4_;
          bVar8 = (bool)((byte)(uVar75 >> 6) & 1);
          auVar122._24_4_ =
               (uint)bVar8 * ((uint)bVar14 * auVar93._24_4_ | !bVar14 * uVar133) |
               !bVar8 * auVar122._24_4_;
          bVar8 = SUB81(uVar75 >> 7,0);
          auVar122._28_4_ =
               (uint)bVar8 * ((uint)bVar15 * auVar93._28_4_ | !bVar15 * uVar134) |
               !bVar8 * auVar122._28_4_;
          uVar74 = (ulong)(byte)((~bVar67 | bVar70) & (byte)uVar74);
        }
      }
      auVar254 = ZEXT3264(local_8c0);
      auVar256 = ZEXT3264(local_8e0);
      auVar243 = ZEXT3264(local_900);
      auVar244 = ZEXT3264(local_920);
      auVar245 = ZEXT3264(local_940);
      auVar247 = ZEXT3264(local_960);
      auVar249 = ZEXT3264(local_980);
      auVar253 = ZEXT3264(local_9a0);
      auVar252 = ZEXT3264(local_700);
      auVar93 = vmulps_avx512vl(local_700,auVar94);
      auVar80 = vfmadd231ps_fma(auVar93,local_3c0,auVar91);
      auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),local_3a0,auVar99);
      _local_200 = _local_600;
      local_1e0 = vminps_avx(local_2e0,auVar121);
      auVar226._8_4_ = 0x7fffffff;
      auVar226._0_8_ = 0x7fffffff7fffffff;
      auVar226._12_4_ = 0x7fffffff;
      auVar226._16_4_ = 0x7fffffff;
      auVar226._20_4_ = 0x7fffffff;
      auVar226._24_4_ = 0x7fffffff;
      auVar226._28_4_ = 0x7fffffff;
      auVar93 = vandps_avx(ZEXT1632(auVar80),auVar226);
      auVar91 = vmaxps_avx(_local_600,auVar122);
      local_300 = auVar91;
      auVar199._8_4_ = 0x3e99999a;
      auVar199._0_8_ = 0x3e99999a3e99999a;
      auVar199._12_4_ = 0x3e99999a;
      auVar199._16_4_ = 0x3e99999a;
      auVar199._20_4_ = 0x3e99999a;
      auVar199._24_4_ = 0x3e99999a;
      auVar199._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar93,auVar199,1);
      local_380._0_2_ = (short)uVar16;
      uVar16 = vcmpps_avx512vl(_local_600,local_1e0,2);
      bVar67 = (byte)uVar16 & bVar64;
      uVar18 = vcmpps_avx512vl(auVar91,local_2e0,2);
      auVar240 = ZEXT3264(local_7c0);
      auVar246 = ZEXT3264(local_7e0);
      auVar248 = ZEXT3264(local_800);
      if ((bVar64 & ((byte)uVar18 | (byte)uVar16)) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar93);
        auVar231 = ZEXT3264(local_8a0);
        auVar232 = ZEXT3264(local_880);
        auVar227 = ZEXT3264(local_560);
        auVar214 = ZEXT3264(local_6e0);
      }
      else {
        uVar75 = CONCAT71((int7)(uVar74 >> 8),~(byte)uVar74);
        auVar93 = vmulps_avx512vl(local_700,auVar98);
        auVar80 = vfmadd213ps_fma(auVar101,local_3c0,auVar93);
        auVar80 = vfmadd213ps_fma(auVar100,local_3a0,ZEXT1632(auVar80));
        auVar93 = vandps_avx(ZEXT1632(auVar80),auVar226);
        uVar16 = vcmpps_avx512vl(auVar93,auVar199,1);
        bVar70 = (byte)uVar16 | ~(byte)uVar74;
        auVar146._8_4_ = 2;
        auVar146._0_8_ = 0x200000002;
        auVar146._12_4_ = 2;
        auVar146._16_4_ = 2;
        auVar146._20_4_ = 2;
        auVar146._24_4_ = 2;
        auVar146._28_4_ = 2;
        auVar38._8_4_ = 3;
        auVar38._0_8_ = 0x300000003;
        auVar38._12_4_ = 3;
        auVar38._16_4_ = 3;
        auVar38._20_4_ = 3;
        auVar38._24_4_ = 3;
        auVar38._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar146,auVar38);
        local_2a0._0_4_ = (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * 2;
        bVar8 = (bool)(bVar70 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * 2;
        local_2a0._28_4_ = (uint)(bVar70 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar70 >> 7) * 2;
        local_320 = vpbroadcastd_avx512vl();
        uVar16 = vpcmpd_avx512vl(local_320,local_2a0,5);
        bVar70 = (byte)uVar16 & bVar67;
        auVar232 = ZEXT3264(local_880);
        if (bVar70 == 0) {
          auVar148._4_4_ = uVar77;
          auVar148._0_4_ = uVar77;
          auVar148._8_4_ = uVar77;
          auVar148._12_4_ = uVar77;
          auVar148._16_4_ = uVar77;
          auVar148._20_4_ = uVar77;
          auVar148._24_4_ = uVar77;
          auVar148._28_4_ = uVar77;
          auVar231 = ZEXT3264(local_8a0);
        }
        else {
          local_2c0 = auVar91;
          local_9b0 = (uint)uVar75;
          auVar86 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar80 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar78 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar85 = vminps_avx(auVar86,auVar78);
          auVar86 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vmaxps_avx(auVar80,auVar86);
          auVar175._8_4_ = 0x7fffffff;
          auVar175._0_8_ = 0x7fffffff7fffffff;
          auVar175._12_4_ = 0x7fffffff;
          auVar80 = vandps_avx(auVar85,auVar175);
          auVar86 = vandps_avx(auVar78,auVar175);
          auVar80 = vmaxps_avx(auVar80,auVar86);
          auVar86 = vmovshdup_avx(auVar80);
          auVar86 = vmaxss_avx(auVar86,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar86);
          fVar135 = auVar80._0_4_ * 1.9073486e-06;
          local_650 = vshufps_avx(auVar78,auVar78,0xff);
          local_360 = (float)local_6c0._0_4_ + (float)local_600._0_4_;
          fStack_35c = (float)local_6c0._4_4_ + (float)local_600._4_4_;
          fStack_358 = fStack_6b8 + fStack_5f8;
          fStack_354 = fStack_6b4 + fStack_5f4;
          fStack_350 = fStack_6b0 + fStack_5f0;
          fStack_34c = fStack_6ac + fStack_5ec;
          fStack_348 = fStack_6a8 + fStack_5e8;
          fStack_344 = fStack_6a4 + fStack_5e4;
          do {
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar147,_local_600);
            auVar124._0_4_ =
                 (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 1 & 1);
            auVar124._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 2 & 1);
            auVar124._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 3 & 1);
            auVar124._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 4 & 1);
            auVar124._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 5 & 1);
            auVar124._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * 0x7f800000;
            auVar124._24_4_ =
                 (uint)(bVar70 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
            auVar124._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar93 = vminps_avx(auVar124,auVar93);
            auVar91 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar91);
            auVar91 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar91);
            uVar16 = vcmpps_avx512vl(auVar124,auVar93,0);
            bVar65 = (byte)uVar16 & bVar70;
            bVar73 = bVar70;
            if (bVar65 != 0) {
              bVar73 = bVar65;
            }
            iVar2 = 0;
            for (uVar77 = (uint)bVar73; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            fVar168 = local_9a8;
            fVar166 = *(float *)(local_1a0 + (uint)(iVar2 << 2));
            uVar136 = 0;
            uVar233 = 0;
            uVar234 = 0;
            fVar164 = *(float *)(local_200 + (uint)(iVar2 << 2));
            uVar235 = 0;
            uVar236 = 0;
            uVar237 = 0;
            if ((float)local_720._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416((uint)*(float *)(local_1a0 + (uint)(iVar2 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar2 << 2)));
              fVar168 = sqrtf((float)local_720._0_4_);
              fVar166 = (float)local_760._0_4_;
              uVar136 = local_760._4_4_;
              uVar233 = local_760._8_4_;
              uVar234 = local_760._12_4_;
              fVar164 = (float)local_780._0_4_;
              uVar235 = local_780._4_4_;
              uVar236 = local_780._8_4_;
              uVar237 = local_780._12_4_;
            }
            lVar69 = 5;
            do {
              auVar91 = local_760;
              auVar93 = local_780;
              auVar138._4_4_ = fVar164;
              auVar138._0_4_ = fVar164;
              auVar138._8_4_ = fVar164;
              auVar138._12_4_ = fVar164;
              auVar86 = vfmadd132ps_fma(auVar138,ZEXT816(0) << 0x40,local_710);
              fVar137 = 1.0 - fVar166;
              auVar176._0_4_ = local_5c0._0_4_ * fVar166;
              auVar176._4_4_ = local_5c0._4_4_ * fVar166;
              auVar176._8_4_ = local_5c0._8_4_ * fVar166;
              auVar176._12_4_ = local_5c0._12_4_ * fVar166;
              local_4e0._0_16_ = ZEXT416((uint)fVar137);
              auVar204._4_4_ = fVar137;
              auVar204._0_4_ = fVar137;
              auVar204._8_4_ = fVar137;
              auVar204._12_4_ = fVar137;
              auVar80 = vfmadd231ps_fma(auVar176,auVar204,local_580._0_16_);
              auVar207._0_4_ = local_5a0._0_4_ * fVar166;
              auVar207._4_4_ = local_5a0._4_4_ * fVar166;
              auVar207._8_4_ = local_5a0._8_4_ * fVar166;
              auVar207._12_4_ = local_5a0._12_4_ * fVar166;
              auVar78 = vfmadd231ps_fma(auVar207,auVar204,local_5c0._0_16_);
              auVar216._0_4_ = fVar166 * (float)local_5e0._0_4_;
              auVar216._4_4_ = fVar166 * (float)local_5e0._4_4_;
              auVar216._8_4_ = fVar166 * fStack_5d8;
              auVar216._12_4_ = fVar166 * fStack_5d4;
              auVar85 = vfmadd231ps_fma(auVar216,auVar204,local_5a0._0_16_);
              auVar222._0_4_ = fVar166 * auVar78._0_4_;
              auVar222._4_4_ = fVar166 * auVar78._4_4_;
              auVar222._8_4_ = fVar166 * auVar78._8_4_;
              auVar222._12_4_ = fVar166 * auVar78._12_4_;
              auVar80 = vfmadd231ps_fma(auVar222,auVar204,auVar80);
              auVar177._0_4_ = fVar166 * auVar85._0_4_;
              auVar177._4_4_ = fVar166 * auVar85._4_4_;
              auVar177._8_4_ = fVar166 * auVar85._8_4_;
              auVar177._12_4_ = fVar166 * auVar85._12_4_;
              auVar78 = vfmadd231ps_fma(auVar177,auVar204,auVar78);
              auVar208._0_4_ = fVar166 * auVar78._0_4_;
              auVar208._4_4_ = fVar166 * auVar78._4_4_;
              auVar208._8_4_ = fVar166 * auVar78._8_4_;
              auVar208._12_4_ = fVar166 * auVar78._12_4_;
              auVar85 = vfmadd231ps_fma(auVar208,auVar80,auVar204);
              auVar80 = vsubps_avx(auVar78,auVar80);
              auVar20._8_4_ = 0x40400000;
              auVar20._0_8_ = 0x4040000040400000;
              auVar20._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar80,auVar20);
              _local_4c0 = auVar85;
              auVar86 = vsubps_avx(auVar86,auVar85);
              auVar80 = vdpps_avx(auVar86,auVar86,0x7f);
              local_7a0._0_16_ = auVar78;
              local_680._0_16_ = auVar80;
              local_760._4_4_ = uVar136;
              local_760._0_4_ = fVar166;
              local_760._8_4_ = uVar233;
              local_760._16_16_ = auVar91._16_16_;
              local_760._12_4_ = uVar234;
              local_780._4_4_ = uVar235;
              local_780._0_4_ = fVar164;
              local_780._8_4_ = uVar236;
              local_780._16_16_ = auVar93._16_16_;
              local_780._12_4_ = uVar237;
              if (auVar80._0_4_ < 0.0) {
                auVar214._0_4_ = sqrtf(auVar80._0_4_);
                auVar214._4_60_ = extraout_var;
                auVar80 = auVar214._0_16_;
                auVar78 = local_7a0._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
              }
              local_500._0_16_ = vdpps_avx(auVar78,auVar78,0x7f);
              fVar164 = local_500._0_4_;
              auVar178._4_12_ = ZEXT812(0) << 0x20;
              auVar178._0_4_ = fVar164;
              local_740._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              fVar166 = local_740._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(local_500._0_16_,auVar21);
              auVar85 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar85._0_4_;
              local_6a0._0_4_ = auVar80._0_4_;
              if (fVar164 < auVar81._0_4_) {
                fVar137 = sqrtf(fVar164);
                auVar80 = ZEXT416((uint)local_6a0._0_4_);
                auVar78 = local_7a0._0_16_;
              }
              else {
                auVar85 = vsqrtss_avx(local_500._0_16_,local_500._0_16_);
                fVar137 = auVar85._0_4_;
              }
              fVar170 = local_740._0_4_;
              fVar164 = fVar166 * 1.5 + fVar164 * -0.5 * fVar170 * fVar170 * fVar170;
              auVar139._0_4_ = auVar78._0_4_ * fVar164;
              auVar139._4_4_ = auVar78._4_4_ * fVar164;
              auVar139._8_4_ = auVar78._8_4_ * fVar164;
              auVar139._12_4_ = auVar78._12_4_ * fVar164;
              local_740._0_16_ = vdpps_avx(auVar139,auVar86,0x7f);
              auVar82 = vaddss_avx512f(auVar80,ZEXT416(0x3f800000));
              auVar140._0_4_ = local_740._0_4_ * local_740._0_4_;
              auVar140._4_4_ = local_740._4_4_ * local_740._4_4_;
              auVar140._8_4_ = local_740._8_4_ * local_740._8_4_;
              auVar140._12_4_ = local_740._12_4_ * local_740._12_4_;
              auVar85 = vsubps_avx(local_680._0_16_,auVar140);
              fVar166 = auVar85._0_4_;
              auVar152._4_12_ = ZEXT812(0) << 0x20;
              auVar152._0_4_ = fVar166;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar152);
              auVar83 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              auVar79 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              uVar72 = fVar166 == 0.0;
              uVar71 = fVar166 < 0.0;
              if ((bool)uVar71) {
                local_620._0_4_ = auVar83._0_4_;
                local_640 = fVar164;
                fStack_63c = fVar164;
                fStack_638 = fVar164;
                fStack_634 = fVar164;
                local_630 = auVar81;
                fVar170 = sqrtf(fVar166);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar83 = ZEXT416((uint)local_620._0_4_);
                auVar80 = ZEXT416((uint)local_6a0._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar78 = local_7a0._0_16_;
                auVar81 = local_630;
                fVar164 = local_640;
                fVar166 = fStack_63c;
                fVar172 = fStack_638;
                fVar202 = fStack_634;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar170 = auVar85._0_4_;
                fVar166 = fVar164;
                fVar172 = fVar164;
                fVar202 = fVar164;
              }
              auVar231 = ZEXT3264(local_8a0);
              auVar232 = ZEXT3264(local_880);
              auVar254 = ZEXT3264(local_8c0);
              auVar240 = ZEXT3264(local_7c0);
              auVar256 = ZEXT3264(local_8e0);
              auVar243 = ZEXT3264(local_900);
              auVar244 = ZEXT3264(local_920);
              auVar245 = ZEXT3264(local_940);
              auVar246 = ZEXT3264(local_7e0);
              auVar247 = ZEXT3264(local_960);
              auVar248 = ZEXT3264(local_800);
              auVar249 = ZEXT3264(local_980);
              auVar250 = ZEXT3264(local_820);
              auVar253 = ZEXT3264(local_9a0);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar150 = auVar85._0_4_ * 6.0;
              fVar165 = local_760._0_4_ * 6.0;
              auVar179._0_4_ = fVar165 * (float)local_5e0._0_4_;
              auVar179._4_4_ = fVar165 * (float)local_5e0._4_4_;
              auVar179._8_4_ = fVar165 * fStack_5d8;
              auVar179._12_4_ = fVar165 * fStack_5d4;
              auVar153._4_4_ = fVar150;
              auVar153._0_4_ = fVar150;
              auVar153._8_4_ = fVar150;
              auVar153._12_4_ = fVar150;
              auVar85 = vfmadd132ps_fma(auVar153,auVar179,local_5a0._0_16_);
              auVar251 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar150 = auVar251._0_4_ * 6.0;
              auVar180._4_4_ = fVar150;
              auVar180._0_4_ = fVar150;
              auVar180._8_4_ = fVar150;
              auVar180._12_4_ = fVar150;
              auVar85 = vfmadd132ps_fma(auVar180,auVar85,local_5c0._0_16_);
              fVar150 = local_4e0._0_4_ * 6.0;
              auVar154._4_4_ = fVar150;
              auVar154._0_4_ = fVar150;
              auVar154._8_4_ = fVar150;
              auVar154._12_4_ = fVar150;
              auVar85 = vfmadd132ps_fma(auVar154,auVar85,local_580._0_16_);
              auVar181._0_4_ = auVar85._0_4_ * (float)local_500._0_4_;
              auVar181._4_4_ = auVar85._4_4_ * (float)local_500._0_4_;
              auVar181._8_4_ = auVar85._8_4_ * (float)local_500._0_4_;
              auVar181._12_4_ = auVar85._12_4_ * (float)local_500._0_4_;
              auVar85 = vdpps_avx(auVar78,auVar85,0x7f);
              fVar150 = auVar85._0_4_;
              auVar155._0_4_ = auVar78._0_4_ * fVar150;
              auVar155._4_4_ = auVar78._4_4_ * fVar150;
              auVar155._8_4_ = auVar78._8_4_ * fVar150;
              auVar155._12_4_ = auVar78._12_4_ * fVar150;
              auVar85 = vsubps_avx(auVar181,auVar155);
              fVar150 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar84 = vxorps_avx512vl(auVar78,auVar22);
              auVar209._0_4_ = fVar164 * auVar85._0_4_ * fVar150;
              auVar209._4_4_ = fVar166 * auVar85._4_4_ * fVar150;
              auVar209._8_4_ = fVar172 * auVar85._8_4_ * fVar150;
              auVar209._12_4_ = fVar202 * auVar85._12_4_ * fVar150;
              auVar242 = ZEXT1664(auVar139);
              auVar85 = vdpps_avx(auVar84,auVar139,0x7f);
              auVar87 = vmaxss_avx(ZEXT416((uint)fVar135),
                                   ZEXT416((uint)((float)local_780._0_4_ * fVar168 * 1.9073486e-06))
                                  );
              auVar251 = vdpps_avx(auVar86,auVar209,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar135),auVar87);
              vfmadd213ss_avx512f(auVar82,ZEXT416((uint)(fVar135 / fVar137)),auVar80);
              auVar80 = vdpps_avx(local_710,auVar139,0x7f);
              fVar164 = auVar85._0_4_ + auVar251._0_4_;
              auVar85 = vdpps_avx(auVar86,auVar84,0x7f);
              auVar82 = vmulss_avx512f(auVar79,auVar81);
              auVar79 = vmulss_avx512f(auVar81,auVar81);
              auVar81 = vdpps_avx(auVar86,local_710,0x7f);
              auVar79 = vaddss_avx512f(auVar83,ZEXT416((uint)(auVar82._0_4_ * auVar79._0_4_)));
              auVar82 = vfnmadd231ss_fma(auVar85,local_740._0_16_,ZEXT416((uint)fVar164));
              auVar83 = vfnmadd231ss_fma(auVar81,local_740._0_16_,auVar80);
              auVar85 = vpermilps_avx(_local_4c0,0xff);
              fVar170 = fVar170 - auVar85._0_4_;
              auVar85 = vshufps_avx(auVar78,auVar78,0xff);
              auVar81 = vfmsub213ss_fma(auVar82,auVar79,auVar85);
              fVar166 = auVar83._0_4_ * auVar79._0_4_;
              auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar81._0_4_)),
                                        ZEXT416((uint)fVar164),ZEXT416((uint)fVar166));
              fVar137 = auVar82._0_4_;
              fVar166 = local_760._0_4_ -
                        (local_740._0_4_ * (fVar166 / fVar137) - fVar170 * (auVar80._0_4_ / fVar137)
                        );
              uVar136 = 0;
              uVar233 = 0;
              uVar234 = 0;
              fVar164 = (float)local_780._0_4_ -
                        (fVar170 * (fVar164 / fVar137) - local_740._0_4_ * (auVar81._0_4_ / fVar137)
                        );
              uVar235 = 0;
              uVar236 = 0;
              uVar237 = 0;
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(local_740._0_16_,auVar23);
              auVar80 = vucomiss_avx512f(auVar80);
              if (!(bool)uVar71 && !(bool)uVar72) {
                auVar80 = vaddss_avx512f(auVar87,auVar80);
                auVar80 = vfmadd231ss_fma(auVar80,local_650,ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar24);
                if (auVar81._0_4_ < auVar80._0_4_) {
                  fVar164 = fVar164 + (float)local_660._0_4_;
                  if ((((fVar164 < fVar203) ||
                       (fVar168 = *(float *)(ray + k * 4 + 0x80), fVar168 < fVar164)) ||
                      (fVar166 < 0.0)) || (1.0 < fVar166)) break;
                  auVar182._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar182._0_4_ = local_680._0_4_;
                  auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar182);
                  fVar137 = auVar80._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar68].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar137 = fVar137 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar137 * fVar137 * fVar137;
                  local_a00 = auVar86._0_4_;
                  fStack_9fc = auVar86._4_4_;
                  fStack_9f8 = auVar86._8_4_;
                  fStack_9f4 = auVar86._12_4_;
                  auVar183._0_4_ = fVar137 * local_a00;
                  auVar183._4_4_ = fVar137 * fStack_9fc;
                  auVar183._8_4_ = fVar137 * fStack_9f8;
                  auVar183._12_4_ = fVar137 * fStack_9f4;
                  auVar85 = vfmadd213ps_fma(auVar85,auVar183,auVar78);
                  auVar80 = vshufps_avx(auVar183,auVar183,0xc9);
                  auVar86 = vshufps_avx(auVar78,auVar78,0xc9);
                  auVar184._0_4_ = auVar183._0_4_ * auVar86._0_4_;
                  auVar184._4_4_ = auVar183._4_4_ * auVar86._4_4_;
                  auVar184._8_4_ = auVar183._8_4_ * auVar86._8_4_;
                  auVar184._12_4_ = auVar183._12_4_ * auVar86._12_4_;
                  auVar78 = vfmsub231ps_fma(auVar184,auVar78,auVar80);
                  auVar80 = vshufps_avx(auVar78,auVar78,0xc9);
                  auVar86 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                  auVar141._0_4_ = auVar85._0_4_ * auVar78._0_4_;
                  auVar141._4_4_ = auVar85._4_4_ * auVar78._4_4_;
                  auVar141._8_4_ = auVar85._8_4_ * auVar78._8_4_;
                  auVar141._12_4_ = auVar85._12_4_ * auVar78._12_4_;
                  auVar80 = vfmsub231ps_fma(auVar141,auVar80,auVar86);
                  uVar136 = auVar80._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar164;
                    uVar233 = vextractps_avx(auVar80,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar233;
                    uVar233 = vextractps_avx(auVar80,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar233;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar136;
                    *(float *)(ray + k * 4 + 0xf0) = fVar166;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_9b8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar68;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar80,auVar80,0x55);
                  auStack_450 = vshufps_avx(auVar80,auVar80,0xaa);
                  local_440 = uVar136;
                  uStack_43c = uVar136;
                  uStack_438 = uVar136;
                  uStack_434 = uVar136;
                  local_430 = fVar166;
                  fStack_42c = fVar166;
                  fStack_428 = fVar166;
                  fStack_424 = fVar166;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar164;
                  local_9d0 = local_490;
                  local_850.valid = (int *)local_9d0;
                  local_850.geometryUserPtr = pGVar6->userPtr;
                  local_850.context = context->user;
                  local_850.hit = local_460;
                  local_850.N = 4;
                  local_7a0._0_4_ = fVar168;
                  local_850.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar242 = ZEXT1664(auVar139);
                    (*pGVar6->intersectionFilterN)(&local_850);
                    auVar253 = ZEXT3264(local_9a0);
                    auVar250 = ZEXT3264(local_820);
                    auVar249 = ZEXT3264(local_980);
                    auVar248 = ZEXT3264(local_800);
                    auVar247 = ZEXT3264(local_960);
                    auVar246 = ZEXT3264(local_7e0);
                    auVar245 = ZEXT3264(local_940);
                    auVar244 = ZEXT3264(local_920);
                    auVar243 = ZEXT3264(local_900);
                    auVar256 = ZEXT3264(local_8e0);
                    auVar240 = ZEXT3264(local_7c0);
                    auVar254 = ZEXT3264(local_8c0);
                    auVar232 = ZEXT3264(local_880);
                    auVar231 = ZEXT3264(local_8a0);
                    fVar168 = (float)local_7a0._0_4_;
                  }
                  uVar74 = vptestmd_avx512vl(local_9d0,local_9d0);
                  if ((uVar74 & 0xf) != 0) {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      (*p_Var7)(&local_850);
                      auVar253 = ZEXT3264(local_9a0);
                      auVar250 = ZEXT3264(local_820);
                      auVar249 = ZEXT3264(local_980);
                      auVar248 = ZEXT3264(local_800);
                      auVar247 = ZEXT3264(local_960);
                      auVar246 = ZEXT3264(local_7e0);
                      auVar245 = ZEXT3264(local_940);
                      auVar244 = ZEXT3264(local_920);
                      auVar243 = ZEXT3264(local_900);
                      auVar256 = ZEXT3264(local_8e0);
                      auVar240 = ZEXT3264(local_7c0);
                      auVar254 = ZEXT3264(local_8c0);
                      auVar232 = ZEXT3264(local_880);
                      auVar231 = ZEXT3264(local_8a0);
                      fVar168 = (float)local_7a0._0_4_;
                    }
                    uVar74 = vptestmd_avx512vl(local_9d0,local_9d0);
                    uVar74 = uVar74 & 0xf;
                    bVar73 = (byte)uVar74;
                    if (bVar73 != 0) {
                      iVar3 = *(int *)(local_850.hit + 4);
                      iVar4 = *(int *)(local_850.hit + 8);
                      iVar1 = *(int *)(local_850.hit + 0xc);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xc0) =
                           (uint)(bVar73 & 1) * *(int *)local_850.hit |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xc0);
                      *(uint *)(local_850.ray + 0xc4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xc4);
                      *(uint *)(local_850.ray + 200) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 200);
                      *(uint *)(local_850.ray + 0xcc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xcc);
                      iVar3 = *(int *)(local_850.hit + 0x14);
                      iVar4 = *(int *)(local_850.hit + 0x18);
                      iVar1 = *(int *)(local_850.hit + 0x1c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xd0) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x10) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xd0);
                      *(uint *)(local_850.ray + 0xd4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xd4);
                      *(uint *)(local_850.ray + 0xd8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0xd8);
                      *(uint *)(local_850.ray + 0xdc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xdc);
                      iVar3 = *(int *)(local_850.hit + 0x24);
                      iVar4 = *(int *)(local_850.hit + 0x28);
                      iVar1 = *(int *)(local_850.hit + 0x2c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xe0) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x20) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xe0);
                      *(uint *)(local_850.ray + 0xe4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xe4);
                      *(uint *)(local_850.ray + 0xe8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0xe8);
                      *(uint *)(local_850.ray + 0xec) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xec);
                      iVar3 = *(int *)(local_850.hit + 0x34);
                      iVar4 = *(int *)(local_850.hit + 0x38);
                      iVar1 = *(int *)(local_850.hit + 0x3c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xf0) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x30) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xf0);
                      *(uint *)(local_850.ray + 0xf4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xf4);
                      *(uint *)(local_850.ray + 0xf8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0xf8);
                      *(uint *)(local_850.ray + 0xfc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xfc);
                      iVar3 = *(int *)(local_850.hit + 0x44);
                      iVar4 = *(int *)(local_850.hit + 0x48);
                      iVar1 = *(int *)(local_850.hit + 0x4c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0x100) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x40) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0x100);
                      *(uint *)(local_850.ray + 0x104) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0x104);
                      *(uint *)(local_850.ray + 0x108) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0x108);
                      *(uint *)(local_850.ray + 0x10c) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0x10c);
                      auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x50));
                      *(undefined1 (*) [16])(local_850.ray + 0x110) = auVar80;
                      auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x60));
                      *(undefined1 (*) [16])(local_850.ray + 0x120) = auVar80;
                      auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x70));
                      *(undefined1 (*) [16])(local_850.ray + 0x130) = auVar80;
                      auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x80));
                      *(undefined1 (*) [16])(local_850.ray + 0x140) = auVar80;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  break;
                }
              }
              lVar69 = lVar69 + -1;
            } while (lVar69 != 0);
            uVar136 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar148._4_4_ = uVar136;
            auVar148._0_4_ = uVar136;
            auVar148._8_4_ = uVar136;
            auVar148._12_4_ = uVar136;
            auVar148._16_4_ = uVar136;
            auVar148._20_4_ = uVar136;
            auVar148._24_4_ = uVar136;
            auVar148._28_4_ = uVar136;
            auVar60._4_4_ = fStack_35c;
            auVar60._0_4_ = local_360;
            auVar60._8_4_ = fStack_358;
            auVar60._12_4_ = fStack_354;
            auVar60._16_4_ = fStack_350;
            auVar60._20_4_ = fStack_34c;
            auVar60._24_4_ = fStack_348;
            auVar60._28_4_ = fStack_344;
            uVar16 = vcmpps_avx512vl(auVar148,auVar60,0xd);
            bVar70 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar70 & (byte)uVar16;
          } while (bVar70 != 0);
          auVar252 = ZEXT3264(local_700);
          uVar75 = (ulong)local_9b0;
          auVar91 = local_2c0;
        }
        bVar70 = local_380[0] | (byte)uVar75;
        auVar162._0_4_ = (float)local_6c0._0_4_ + auVar91._0_4_;
        auVar162._4_4_ = (float)local_6c0._4_4_ + auVar91._4_4_;
        auVar162._8_4_ = fStack_6b8 + auVar91._8_4_;
        auVar162._12_4_ = fStack_6b4 + auVar91._12_4_;
        auVar162._16_4_ = fStack_6b0 + auVar91._16_4_;
        auVar162._20_4_ = fStack_6ac + auVar91._20_4_;
        auVar162._24_4_ = fStack_6a8 + auVar91._24_4_;
        auVar162._28_4_ = fStack_6a4 + auVar91._28_4_;
        uVar16 = vcmpps_avx512vl(auVar162,auVar148,2);
        bVar64 = (byte)uVar18 & bVar64 & (byte)uVar16;
        auVar163._8_4_ = 2;
        auVar163._0_8_ = 0x200000002;
        auVar163._12_4_ = 2;
        auVar163._16_4_ = 2;
        auVar163._20_4_ = 2;
        auVar163._24_4_ = 2;
        auVar163._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar93 = vpblendmd_avx512vl(auVar163,auVar39);
        auVar125._0_4_ = (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * 2;
        bVar8 = (bool)(bVar70 >> 1 & 1);
        auVar125._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 2 & 1);
        auVar125._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 3 & 1);
        auVar125._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 4 & 1);
        auVar125._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 5 & 1);
        auVar125._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * 2;
        bVar8 = (bool)(bVar70 >> 6 & 1);
        auVar125._24_4_ = (uint)bVar8 * auVar93._24_4_ | (uint)!bVar8 * 2;
        auVar125._28_4_ = (uint)(bVar70 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar70 >> 7) * 2;
        uVar16 = vpcmpd_avx512vl(local_320,auVar125,5);
        bVar70 = (byte)uVar16 & bVar64;
        fVar135 = (float)local_6c0._0_4_;
        fVar164 = (float)local_6c0._4_4_;
        fVar166 = fStack_6b8;
        fVar168 = fStack_6b4;
        fVar137 = fStack_6b0;
        fVar170 = fStack_6ac;
        fVar172 = fStack_6a8;
        fVar202 = fStack_6a4;
        if (bVar70 != 0) {
          local_380 = auVar125;
          auVar86 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar80 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar78 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar85 = vminps_avx(auVar86,auVar78);
          auVar86 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar78 = vmaxps_avx(auVar80,auVar86);
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar80 = vandps_avx(auVar85,auVar185);
          auVar86 = vandps_avx(auVar78,auVar185);
          auVar80 = vmaxps_avx(auVar80,auVar86);
          auVar86 = vmovshdup_avx(auVar80);
          auVar86 = vmaxss_avx(auVar86,auVar80);
          auVar80 = vshufpd_avx(auVar80,auVar80,1);
          auVar80 = vmaxss_avx(auVar80,auVar86);
          fVar135 = auVar80._0_4_ * 1.9073486e-06;
          local_650 = vshufps_avx(auVar78,auVar78,0xff);
          local_360 = (float)local_6c0._0_4_ + local_300._0_4_;
          fStack_35c = (float)local_6c0._4_4_ + local_300._4_4_;
          fStack_358 = fStack_6b8 + local_300._8_4_;
          fStack_354 = fStack_6b4 + local_300._12_4_;
          fStack_350 = fStack_6b0 + local_300._16_4_;
          fStack_34c = fStack_6ac + local_300._20_4_;
          fStack_348 = fStack_6a8 + local_300._24_4_;
          fStack_344 = fStack_6a4 + local_300._28_4_;
          _local_600 = local_300;
          do {
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar149,_local_600);
            auVar126._0_4_ =
                 (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar8 * auVar93._4_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar8 * auVar93._8_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar8 * auVar93._12_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar8 * auVar93._16_4_ | (uint)!bVar8 * 0x7f800000;
            bVar8 = (bool)(bVar70 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar8 * auVar93._20_4_ | (uint)!bVar8 * 0x7f800000;
            auVar126._24_4_ =
                 (uint)(bVar70 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar93 = vminps_avx(auVar126,auVar93);
            auVar91 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar91);
            auVar91 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar91);
            uVar16 = vcmpps_avx512vl(auVar126,auVar93,0);
            bVar65 = (byte)uVar16 & bVar70;
            bVar73 = bVar70;
            if (bVar65 != 0) {
              bVar73 = bVar65;
            }
            iVar2 = 0;
            for (uVar77 = (uint)bVar73; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            fVar168 = local_9a4;
            fVar166 = *(float *)(local_1c0 + (uint)(iVar2 << 2));
            uVar136 = 0;
            uVar233 = 0;
            uVar234 = 0;
            fVar164 = *(float *)(local_2e0 + (uint)(iVar2 << 2));
            uVar235 = 0;
            uVar236 = 0;
            uVar237 = 0;
            if ((float)local_720._0_4_ < 0.0) {
              local_760._0_16_ = ZEXT416((uint)*(float *)(local_1c0 + (uint)(iVar2 << 2)));
              local_780._0_16_ = ZEXT416((uint)*(float *)(local_2e0 + (uint)(iVar2 << 2)));
              fVar168 = sqrtf((float)local_720._0_4_);
              fVar166 = (float)local_760._0_4_;
              uVar136 = local_760._4_4_;
              uVar233 = local_760._8_4_;
              uVar234 = local_760._12_4_;
              fVar164 = (float)local_780._0_4_;
              uVar235 = local_780._4_4_;
              uVar236 = local_780._8_4_;
              uVar237 = local_780._12_4_;
            }
            lVar69 = 5;
            do {
              auVar91 = local_760;
              auVar93 = local_780;
              auVar142._4_4_ = fVar164;
              auVar142._0_4_ = fVar164;
              auVar142._8_4_ = fVar164;
              auVar142._12_4_ = fVar164;
              auVar86 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_710);
              fVar137 = 1.0 - fVar166;
              auVar186._0_4_ = local_5c0._0_4_ * fVar166;
              auVar186._4_4_ = local_5c0._4_4_ * fVar166;
              auVar186._8_4_ = local_5c0._8_4_ * fVar166;
              auVar186._12_4_ = local_5c0._12_4_ * fVar166;
              local_4e0._0_16_ = ZEXT416((uint)fVar137);
              auVar205._4_4_ = fVar137;
              auVar205._0_4_ = fVar137;
              auVar205._8_4_ = fVar137;
              auVar205._12_4_ = fVar137;
              auVar80 = vfmadd231ps_fma(auVar186,auVar205,local_580._0_16_);
              auVar210._0_4_ = local_5a0._0_4_ * fVar166;
              auVar210._4_4_ = local_5a0._4_4_ * fVar166;
              auVar210._8_4_ = local_5a0._8_4_ * fVar166;
              auVar210._12_4_ = local_5a0._12_4_ * fVar166;
              auVar78 = vfmadd231ps_fma(auVar210,auVar205,local_5c0._0_16_);
              auVar217._0_4_ = fVar166 * (float)local_5e0._0_4_;
              auVar217._4_4_ = fVar166 * (float)local_5e0._4_4_;
              auVar217._8_4_ = fVar166 * fStack_5d8;
              auVar217._12_4_ = fVar166 * fStack_5d4;
              auVar85 = vfmadd231ps_fma(auVar217,auVar205,local_5a0._0_16_);
              auVar223._0_4_ = fVar166 * auVar78._0_4_;
              auVar223._4_4_ = fVar166 * auVar78._4_4_;
              auVar223._8_4_ = fVar166 * auVar78._8_4_;
              auVar223._12_4_ = fVar166 * auVar78._12_4_;
              auVar80 = vfmadd231ps_fma(auVar223,auVar205,auVar80);
              auVar187._0_4_ = fVar166 * auVar85._0_4_;
              auVar187._4_4_ = fVar166 * auVar85._4_4_;
              auVar187._8_4_ = fVar166 * auVar85._8_4_;
              auVar187._12_4_ = fVar166 * auVar85._12_4_;
              auVar78 = vfmadd231ps_fma(auVar187,auVar205,auVar78);
              auVar211._0_4_ = fVar166 * auVar78._0_4_;
              auVar211._4_4_ = fVar166 * auVar78._4_4_;
              auVar211._8_4_ = fVar166 * auVar78._8_4_;
              auVar211._12_4_ = fVar166 * auVar78._12_4_;
              auVar85 = vfmadd231ps_fma(auVar211,auVar80,auVar205);
              auVar80 = vsubps_avx(auVar78,auVar80);
              auVar25._8_4_ = 0x40400000;
              auVar25._0_8_ = 0x4040000040400000;
              auVar25._12_4_ = 0x40400000;
              auVar78 = vmulps_avx512vl(auVar80,auVar25);
              _local_4c0 = auVar85;
              auVar80 = vsubps_avx(auVar86,auVar85);
              local_7a0._0_16_ = auVar80;
              auVar80 = vdpps_avx(auVar80,auVar80,0x7f);
              local_680._0_16_ = auVar80;
              local_760._4_4_ = uVar136;
              local_760._0_4_ = fVar166;
              local_760._8_4_ = uVar233;
              local_760._16_16_ = auVar91._16_16_;
              local_760._12_4_ = uVar234;
              local_780._4_4_ = uVar235;
              local_780._0_4_ = fVar164;
              local_780._8_4_ = uVar236;
              local_780._16_16_ = auVar93._16_16_;
              local_780._12_4_ = uVar237;
              if (auVar80._0_4_ < 0.0) {
                auVar227._0_4_ = sqrtf(auVar80._0_4_);
                auVar227._4_60_ = extraout_var_00;
                auVar80 = auVar227._0_16_;
              }
              else {
                auVar80 = vsqrtss_avx(auVar80,auVar80);
              }
              local_500._0_16_ = vdpps_avx(auVar78,auVar78,0x7f);
              fVar164 = local_500._0_4_;
              auVar188._4_12_ = ZEXT812(0) << 0x20;
              auVar188._0_4_ = fVar164;
              local_740._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              fVar166 = local_740._0_4_;
              local_520._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              auVar26._8_4_ = 0x80000000;
              auVar26._0_8_ = 0x8000000080000000;
              auVar26._12_4_ = 0x80000000;
              auVar85 = vxorps_avx512vl(local_500._0_16_,auVar26);
              auVar86 = vfnmadd213ss_fma(local_520._0_16_,local_500._0_16_,ZEXT416(0x40000000));
              local_540._0_4_ = auVar86._0_4_;
              local_6a0._0_4_ = auVar80._0_4_;
              if (fVar164 < auVar85._0_4_) {
                auVar231._0_4_ = sqrtf(fVar164);
                auVar231._4_60_ = extraout_var_01;
                auVar80 = ZEXT416((uint)local_6a0._0_4_);
                auVar86 = auVar231._0_16_;
              }
              else {
                auVar86 = vsqrtss_avx512f(local_500._0_16_,local_500._0_16_);
              }
              fVar137 = local_740._0_4_;
              fVar164 = fVar166 * 1.5 + fVar164 * -0.5 * fVar137 * fVar137 * fVar137;
              auVar241._0_4_ = auVar78._0_4_ * fVar164;
              auVar241._4_4_ = auVar78._4_4_ * fVar164;
              auVar241._8_4_ = auVar78._8_4_ * fVar164;
              auVar241._12_4_ = auVar78._12_4_ * fVar164;
              local_740._0_16_ = vdpps_avx(local_7a0._0_16_,auVar241,0x7f);
              auVar82 = vaddss_avx512f(auVar80,ZEXT416(0x3f800000));
              auVar143._0_4_ = local_740._0_4_ * local_740._0_4_;
              auVar143._4_4_ = local_740._4_4_ * local_740._4_4_;
              auVar143._8_4_ = local_740._8_4_ * local_740._8_4_;
              auVar143._12_4_ = local_740._12_4_ * local_740._12_4_;
              auVar85 = vsubps_avx(local_680._0_16_,auVar143);
              fVar166 = auVar85._0_4_;
              auVar156._4_12_ = ZEXT812(0) << 0x20;
              auVar156._0_4_ = fVar166;
              auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar156);
              auVar83 = vmulss_avx512f(auVar81,ZEXT416(0x3fc00000));
              auVar79 = vmulss_avx512f(auVar85,ZEXT416(0xbf000000));
              uVar72 = fVar166 == 0.0;
              uVar71 = fVar166 < 0.0;
              if ((bool)uVar71) {
                local_640 = fVar164;
                fStack_63c = fVar164;
                fStack_638 = fVar164;
                fStack_634 = fVar164;
                local_630 = auVar241;
                local_620 = auVar81;
                fVar137 = sqrtf(fVar166);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar86 = ZEXT416(auVar86._0_4_);
                auVar80 = ZEXT416((uint)local_6a0._0_4_);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar241 = local_630;
                auVar81 = local_620;
                fVar164 = local_640;
                fVar166 = fStack_63c;
                fVar170 = fStack_638;
                fVar172 = fStack_634;
              }
              else {
                auVar85 = vsqrtss_avx(auVar85,auVar85);
                fVar137 = auVar85._0_4_;
                fVar166 = fVar164;
                fVar170 = fVar164;
                fVar172 = fVar164;
              }
              auVar242 = ZEXT1664(auVar241);
              auVar231 = ZEXT3264(local_8a0);
              auVar232 = ZEXT3264(local_880);
              auVar254 = ZEXT3264(local_8c0);
              auVar240 = ZEXT3264(local_7c0);
              auVar256 = ZEXT3264(local_8e0);
              auVar243 = ZEXT3264(local_900);
              auVar244 = ZEXT3264(local_920);
              auVar245 = ZEXT3264(local_940);
              auVar246 = ZEXT3264(local_7e0);
              auVar247 = ZEXT3264(local_960);
              auVar248 = ZEXT3264(local_800);
              auVar249 = ZEXT3264(local_980);
              auVar250 = ZEXT3264(local_820);
              auVar253 = ZEXT3264(local_9a0);
              auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_760._0_16_,
                                        local_4e0._0_16_);
              fVar202 = auVar85._0_4_ * 6.0;
              fVar150 = local_760._0_4_ * 6.0;
              auVar189._0_4_ = fVar150 * (float)local_5e0._0_4_;
              auVar189._4_4_ = fVar150 * (float)local_5e0._4_4_;
              auVar189._8_4_ = fVar150 * fStack_5d8;
              auVar189._12_4_ = fVar150 * fStack_5d4;
              auVar157._4_4_ = fVar202;
              auVar157._0_4_ = fVar202;
              auVar157._8_4_ = fVar202;
              auVar157._12_4_ = fVar202;
              auVar85 = vfmadd132ps_fma(auVar157,auVar189,local_5a0._0_16_);
              auVar251 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_4e0._0_16_,
                                         local_760._0_16_);
              fVar202 = auVar251._0_4_ * 6.0;
              auVar190._4_4_ = fVar202;
              auVar190._0_4_ = fVar202;
              auVar190._8_4_ = fVar202;
              auVar190._12_4_ = fVar202;
              auVar85 = vfmadd132ps_fma(auVar190,auVar85,local_5c0._0_16_);
              fVar202 = local_4e0._0_4_ * 6.0;
              auVar158._4_4_ = fVar202;
              auVar158._0_4_ = fVar202;
              auVar158._8_4_ = fVar202;
              auVar158._12_4_ = fVar202;
              auVar85 = vfmadd132ps_fma(auVar158,auVar85,local_580._0_16_);
              auVar191._0_4_ = auVar85._0_4_ * (float)local_500._0_4_;
              auVar191._4_4_ = auVar85._4_4_ * (float)local_500._0_4_;
              auVar191._8_4_ = auVar85._8_4_ * (float)local_500._0_4_;
              auVar191._12_4_ = auVar85._12_4_ * (float)local_500._0_4_;
              auVar85 = vdpps_avx(auVar78,auVar85,0x7f);
              fVar202 = auVar85._0_4_;
              auVar159._0_4_ = auVar78._0_4_ * fVar202;
              auVar159._4_4_ = auVar78._4_4_ * fVar202;
              auVar159._8_4_ = auVar78._8_4_ * fVar202;
              auVar159._12_4_ = auVar78._12_4_ * fVar202;
              auVar85 = vsubps_avx(auVar191,auVar159);
              fVar202 = (float)local_540._0_4_ * (float)local_520._0_4_;
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar87 = vxorps_avx512vl(auVar78,auVar27);
              auVar212._0_4_ = fVar164 * auVar85._0_4_ * fVar202;
              auVar212._4_4_ = fVar166 * auVar85._4_4_ * fVar202;
              auVar212._8_4_ = fVar170 * auVar85._8_4_ * fVar202;
              auVar212._12_4_ = fVar172 * auVar85._12_4_ * fVar202;
              auVar85 = vdpps_avx(auVar87,auVar241,0x7f);
              auVar251 = vmaxss_avx(ZEXT416((uint)fVar135),
                                    ZEXT416((uint)((float)local_780._0_4_ * fVar168 * 1.9073486e-06)
                                           ));
              auVar84 = vdivss_avx512f(ZEXT416((uint)fVar135),auVar86);
              auVar86 = vdpps_avx(local_7a0._0_16_,auVar212,0x7f);
              auVar80 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar135),auVar251);
              vfmadd213ss_avx512f(auVar82,auVar84,auVar80);
              auVar80 = vdpps_avx(local_710,auVar241,0x7f);
              fVar164 = auVar85._0_4_ + auVar86._0_4_;
              auVar86 = vdpps_avx(local_7a0._0_16_,auVar87,0x7f);
              auVar82 = vmulss_avx512f(auVar79,auVar81);
              auVar81 = vmulss_avx512f(auVar81,auVar81);
              auVar85 = vdpps_avx(local_7a0._0_16_,local_710,0x7f);
              auVar81 = vaddss_avx512f(auVar83,ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)));
              auVar82 = vfnmadd231ss_avx512f(auVar86,local_740._0_16_,ZEXT416((uint)fVar164));
              auVar83 = vfnmadd231ss_avx512f(auVar85,local_740._0_16_,auVar80);
              auVar86 = vpermilps_avx(_local_4c0,0xff);
              fVar137 = fVar137 - auVar86._0_4_;
              auVar86 = vshufps_avx(auVar78,auVar78,0xff);
              auVar85 = vfmsub213ss_fma(auVar82,auVar81,auVar86);
              fVar166 = auVar83._0_4_ * auVar81._0_4_;
              auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar85._0_4_)),
                                        ZEXT416((uint)fVar164),ZEXT416((uint)fVar166));
              fVar170 = auVar81._0_4_;
              auVar224._0_4_ = fVar166 / fVar170;
              auVar224._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar218._0_4_ = auVar85._0_4_ / fVar170;
              auVar218._4_12_ = auVar85._4_12_;
              auVar85 = vmulss_avx512f(local_740._0_16_,auVar224);
              auVar81 = vmulss_avx512f(local_740._0_16_,auVar218);
              fVar166 = local_760._0_4_ - (auVar85._0_4_ - fVar137 * (auVar80._0_4_ / fVar170));
              uVar136 = 0;
              uVar233 = 0;
              uVar234 = 0;
              fVar164 = (float)local_780._0_4_ - (fVar137 * (fVar164 / fVar170) - auVar81._0_4_);
              uVar235 = 0;
              uVar236 = 0;
              uVar237 = 0;
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar80 = vandps_avx512vl(local_740._0_16_,auVar28);
              auVar80 = vucomiss_avx512f(auVar80);
              if (!(bool)uVar71 && !(bool)uVar72) {
                auVar80 = vaddss_avx512f(auVar251,auVar80);
                auVar80 = vfmadd231ss_fma(auVar80,local_650,ZEXT416(0x36000000));
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar85 = vandps_avx512vl(ZEXT416((uint)fVar137),auVar29);
                if (auVar85._0_4_ < auVar80._0_4_) {
                  fVar164 = fVar164 + (float)local_660._0_4_;
                  if ((((fVar164 < fVar203) ||
                       (fVar168 = *(float *)(ray + k * 4 + 0x80), fVar168 < fVar164)) ||
                      (fVar166 < 0.0)) || (1.0 < fVar166)) break;
                  auVar192._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar192._0_4_ = local_680._0_4_;
                  auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar192);
                  fVar137 = auVar80._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar68].ptr;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                  fVar137 = fVar137 * 1.5 +
                            (float)local_680._0_4_ * -0.5 * fVar137 * fVar137 * fVar137;
                  auVar193._0_4_ = local_7a0._0_4_ * fVar137;
                  auVar193._4_4_ = local_7a0._4_4_ * fVar137;
                  auVar193._8_4_ = local_7a0._8_4_ * fVar137;
                  auVar193._12_4_ = local_7a0._12_4_ * fVar137;
                  auVar85 = vfmadd213ps_fma(auVar86,auVar193,auVar78);
                  auVar80 = vshufps_avx(auVar193,auVar193,0xc9);
                  auVar86 = vshufps_avx(auVar78,auVar78,0xc9);
                  auVar194._0_4_ = auVar193._0_4_ * auVar86._0_4_;
                  auVar194._4_4_ = auVar193._4_4_ * auVar86._4_4_;
                  auVar194._8_4_ = auVar193._8_4_ * auVar86._8_4_;
                  auVar194._12_4_ = auVar193._12_4_ * auVar86._12_4_;
                  auVar78 = vfmsub231ps_fma(auVar194,auVar78,auVar80);
                  auVar80 = vshufps_avx(auVar78,auVar78,0xc9);
                  auVar86 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                  auVar144._0_4_ = auVar85._0_4_ * auVar78._0_4_;
                  auVar144._4_4_ = auVar85._4_4_ * auVar78._4_4_;
                  auVar144._8_4_ = auVar85._8_4_ * auVar78._8_4_;
                  auVar144._12_4_ = auVar85._12_4_ * auVar78._12_4_;
                  auVar80 = vfmsub231ps_fma(auVar144,auVar80,auVar86);
                  uVar136 = auVar80._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar164;
                    uVar233 = vextractps_avx(auVar80,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar233;
                    uVar233 = vextractps_avx(auVar80,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar233;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar136;
                    *(float *)(ray + k * 4 + 0xf0) = fVar166;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_9b8;
                    *(uint *)(ray + k * 4 + 0x120) = uVar68;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_460 = (RTCHitN  [16])vshufps_avx(auVar80,auVar80,0x55);
                  auStack_450 = vshufps_avx(auVar80,auVar80,0xaa);
                  local_440 = uVar136;
                  uStack_43c = uVar136;
                  uStack_438 = uVar136;
                  uStack_434 = uVar136;
                  local_430 = fVar166;
                  fStack_42c = fVar166;
                  fStack_428 = fVar166;
                  fStack_424 = fVar166;
                  local_420 = ZEXT416(0) << 0x20;
                  local_410 = local_480._0_8_;
                  uStack_408 = local_480._8_8_;
                  local_400 = local_470;
                  vpcmpeqd_avx2(ZEXT1632(local_470),ZEXT1632(local_470));
                  uStack_3ec = context->user->instID[0];
                  local_3f0 = uStack_3ec;
                  uStack_3e8 = uStack_3ec;
                  uStack_3e4 = uStack_3ec;
                  uStack_3e0 = context->user->instPrimID[0];
                  uStack_3dc = uStack_3e0;
                  uStack_3d8 = uStack_3e0;
                  uStack_3d4 = uStack_3e0;
                  *(float *)(ray + k * 4 + 0x80) = fVar164;
                  local_9d0 = local_490;
                  local_850.valid = (int *)local_9d0;
                  local_850.geometryUserPtr = pGVar6->userPtr;
                  local_850.context = context->user;
                  local_850.hit = local_460;
                  local_850.N = 4;
                  local_850.ray = (RTCRayN *)ray;
                  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar242 = ZEXT1664(auVar241);
                    (*pGVar6->intersectionFilterN)(&local_850);
                    auVar253 = ZEXT3264(local_9a0);
                    auVar250 = ZEXT3264(local_820);
                    auVar249 = ZEXT3264(local_980);
                    auVar248 = ZEXT3264(local_800);
                    auVar247 = ZEXT3264(local_960);
                    auVar246 = ZEXT3264(local_7e0);
                    auVar245 = ZEXT3264(local_940);
                    auVar244 = ZEXT3264(local_920);
                    auVar243 = ZEXT3264(local_900);
                    auVar256 = ZEXT3264(local_8e0);
                    auVar240 = ZEXT3264(local_7c0);
                    auVar254 = ZEXT3264(local_8c0);
                    auVar232 = ZEXT3264(local_880);
                    auVar231 = ZEXT3264(local_8a0);
                  }
                  uVar74 = vptestmd_avx512vl(local_9d0,local_9d0);
                  if ((uVar74 & 0xf) != 0) {
                    p_Var7 = context->args->filter;
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      (*p_Var7)(&local_850);
                      auVar253 = ZEXT3264(local_9a0);
                      auVar250 = ZEXT3264(local_820);
                      auVar249 = ZEXT3264(local_980);
                      auVar248 = ZEXT3264(local_800);
                      auVar247 = ZEXT3264(local_960);
                      auVar246 = ZEXT3264(local_7e0);
                      auVar245 = ZEXT3264(local_940);
                      auVar244 = ZEXT3264(local_920);
                      auVar243 = ZEXT3264(local_900);
                      auVar256 = ZEXT3264(local_8e0);
                      auVar240 = ZEXT3264(local_7c0);
                      auVar254 = ZEXT3264(local_8c0);
                      auVar232 = ZEXT3264(local_880);
                      auVar231 = ZEXT3264(local_8a0);
                    }
                    uVar74 = vptestmd_avx512vl(local_9d0,local_9d0);
                    uVar74 = uVar74 & 0xf;
                    bVar73 = (byte)uVar74;
                    if (bVar73 != 0) {
                      iVar3 = *(int *)(local_850.hit + 4);
                      iVar4 = *(int *)(local_850.hit + 8);
                      iVar1 = *(int *)(local_850.hit + 0xc);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xc0) =
                           (uint)(bVar73 & 1) * *(int *)local_850.hit |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xc0);
                      *(uint *)(local_850.ray + 0xc4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xc4);
                      *(uint *)(local_850.ray + 200) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 200);
                      *(uint *)(local_850.ray + 0xcc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xcc);
                      iVar3 = *(int *)(local_850.hit + 0x14);
                      iVar4 = *(int *)(local_850.hit + 0x18);
                      iVar1 = *(int *)(local_850.hit + 0x1c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xd0) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x10) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xd0);
                      *(uint *)(local_850.ray + 0xd4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xd4);
                      *(uint *)(local_850.ray + 0xd8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0xd8);
                      *(uint *)(local_850.ray + 0xdc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xdc);
                      iVar3 = *(int *)(local_850.hit + 0x24);
                      iVar4 = *(int *)(local_850.hit + 0x28);
                      iVar1 = *(int *)(local_850.hit + 0x2c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xe0) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x20) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xe0);
                      *(uint *)(local_850.ray + 0xe4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xe4);
                      *(uint *)(local_850.ray + 0xe8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0xe8);
                      *(uint *)(local_850.ray + 0xec) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xec);
                      iVar3 = *(int *)(local_850.hit + 0x34);
                      iVar4 = *(int *)(local_850.hit + 0x38);
                      iVar1 = *(int *)(local_850.hit + 0x3c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0xf0) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x30) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0xf0);
                      *(uint *)(local_850.ray + 0xf4) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0xf4);
                      *(uint *)(local_850.ray + 0xf8) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0xf8);
                      *(uint *)(local_850.ray + 0xfc) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0xfc);
                      iVar3 = *(int *)(local_850.hit + 0x44);
                      iVar4 = *(int *)(local_850.hit + 0x48);
                      iVar1 = *(int *)(local_850.hit + 0x4c);
                      bVar8 = (bool)((byte)(uVar74 >> 1) & 1);
                      bVar9 = (bool)((byte)(uVar74 >> 2) & 1);
                      bVar10 = SUB81(uVar74 >> 3,0);
                      *(uint *)(local_850.ray + 0x100) =
                           (uint)(bVar73 & 1) * *(int *)(local_850.hit + 0x40) |
                           (uint)!(bool)(bVar73 & 1) * *(int *)(local_850.ray + 0x100);
                      *(uint *)(local_850.ray + 0x104) =
                           (uint)bVar8 * iVar3 | (uint)!bVar8 * *(int *)(local_850.ray + 0x104);
                      *(uint *)(local_850.ray + 0x108) =
                           (uint)bVar9 * iVar4 | (uint)!bVar9 * *(int *)(local_850.ray + 0x108);
                      *(uint *)(local_850.ray + 0x10c) =
                           (uint)bVar10 * iVar1 | (uint)!bVar10 * *(int *)(local_850.ray + 0x10c);
                      auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x50));
                      *(undefined1 (*) [16])(local_850.ray + 0x110) = auVar80;
                      auVar80 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x60));
                      *(undefined1 (*) [16])(local_850.ray + 0x120) = auVar80;
                      auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x70));
                      *(undefined1 (*) [16])(local_850.ray + 0x130) = auVar80;
                      auVar80 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_850.hit + 0x80));
                      *(undefined1 (*) [16])(local_850.ray + 0x140) = auVar80;
                      break;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar168;
                  break;
                }
              }
              lVar69 = lVar69 + -1;
            } while (lVar69 != 0);
            uVar136 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar148._4_4_ = uVar136;
            auVar148._0_4_ = uVar136;
            auVar148._8_4_ = uVar136;
            auVar148._12_4_ = uVar136;
            auVar148._16_4_ = uVar136;
            auVar148._20_4_ = uVar136;
            auVar148._24_4_ = uVar136;
            auVar148._28_4_ = uVar136;
            auVar61._4_4_ = fStack_35c;
            auVar61._0_4_ = local_360;
            auVar61._8_4_ = fStack_358;
            auVar61._12_4_ = fStack_354;
            auVar61._16_4_ = fStack_350;
            auVar61._20_4_ = fStack_34c;
            auVar61._24_4_ = fStack_348;
            auVar61._28_4_ = fStack_344;
            uVar16 = vcmpps_avx512vl(auVar148,auVar61,0xd);
            bVar70 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar70 & (byte)uVar16;
          } while (bVar70 != 0);
          auVar252 = ZEXT3264(local_700);
          auVar125 = local_380;
          fVar135 = (float)local_6c0._0_4_;
          fVar164 = (float)local_6c0._4_4_;
          fVar166 = fStack_6b8;
          fVar168 = fStack_6b4;
          fVar137 = fStack_6b0;
          fVar170 = fStack_6ac;
          fVar172 = fStack_6a8;
          fVar202 = fStack_6a4;
        }
        auVar214 = ZEXT3264(local_6e0);
        uVar18 = vpcmpgtd_avx512vl(auVar125,local_320);
        uVar19 = vpcmpd_avx512vl(local_320,local_2a0,1);
        auVar200._0_4_ = fVar135 + (float)local_200._0_4_;
        auVar200._4_4_ = fVar164 + (float)local_200._4_4_;
        auVar200._8_4_ = fVar166 + fStack_1f8;
        auVar200._12_4_ = fVar168 + fStack_1f4;
        auVar200._16_4_ = fVar137 + fStack_1f0;
        auVar200._20_4_ = fVar170 + fStack_1ec;
        auVar200._24_4_ = fVar172 + fStack_1e8;
        auVar200._28_4_ = fVar202 + fStack_1e4;
        uVar16 = vcmpps_avx512vl(auVar200,auVar148,2);
        bVar67 = bVar67 & (byte)uVar19 & (byte)uVar16;
        auVar201._0_4_ = fVar135 + local_300._0_4_;
        auVar201._4_4_ = fVar164 + local_300._4_4_;
        auVar201._8_4_ = fVar166 + local_300._8_4_;
        auVar201._12_4_ = fVar168 + local_300._12_4_;
        auVar201._16_4_ = fVar137 + local_300._16_4_;
        auVar201._20_4_ = fVar170 + local_300._20_4_;
        auVar201._24_4_ = fVar172 + local_300._24_4_;
        auVar201._28_4_ = fVar202 + local_300._28_4_;
        uVar16 = vcmpps_avx512vl(auVar201,auVar148,2);
        bVar64 = bVar64 & (byte)uVar18 & (byte)uVar16 | bVar67;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar255 = ZEXT3264(auVar93);
        auVar227 = ZEXT3264(local_560);
        prim = local_610;
        if (bVar64 != 0) {
          abStack_180[uVar66 * 0x60] = bVar64;
          auVar127._0_4_ =
               (uint)(bVar67 & 1) * local_200._0_4_ |
               (uint)!(bool)(bVar67 & 1) * (int)local_300._0_4_;
          bVar8 = (bool)(bVar67 >> 1 & 1);
          auVar127._4_4_ = (uint)bVar8 * local_200._4_4_ | (uint)!bVar8 * (int)local_300._4_4_;
          bVar8 = (bool)(bVar67 >> 2 & 1);
          auVar127._8_4_ = (uint)bVar8 * (int)fStack_1f8 | (uint)!bVar8 * (int)local_300._8_4_;
          bVar8 = (bool)(bVar67 >> 3 & 1);
          auVar127._12_4_ = (uint)bVar8 * (int)fStack_1f4 | (uint)!bVar8 * (int)local_300._12_4_;
          bVar8 = (bool)(bVar67 >> 4 & 1);
          auVar127._16_4_ = (uint)bVar8 * (int)fStack_1f0 | (uint)!bVar8 * (int)local_300._16_4_;
          bVar8 = (bool)(bVar67 >> 5 & 1);
          auVar127._20_4_ = (uint)bVar8 * (int)fStack_1ec | (uint)!bVar8 * (int)local_300._20_4_;
          auVar127._24_4_ =
               (uint)(bVar67 >> 6) * (int)fStack_1e8 |
               (uint)!(bool)(bVar67 >> 6) * (int)local_300._24_4_;
          auVar127._28_4_ = local_300._28_4_;
          *(undefined1 (*) [32])(auStack_160 + uVar66 * 0x60) = auVar127;
          uVar74 = vmovlps_avx(local_330);
          (&uStack_140)[uVar66 * 0xc] = uVar74;
          aiStack_138[uVar66 * 0x18] = local_9ac + 1;
          uVar66 = (ulong)((int)uVar66 + 1);
        }
      }
    }
    do {
      uVar77 = (uint)uVar66;
      uVar66 = (ulong)(uVar77 - 1);
      if (uVar77 == 0) {
        uVar136 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar41._4_4_ = uVar136;
        auVar41._0_4_ = uVar136;
        auVar41._8_4_ = uVar136;
        auVar41._12_4_ = uVar136;
        auVar41._16_4_ = uVar136;
        auVar41._20_4_ = uVar136;
        auVar41._24_4_ = uVar136;
        auVar41._28_4_ = uVar136;
        uVar16 = vcmpps_avx512vl(local_280,auVar41,2);
        uVar68 = (uint)uVar16 & (uint)local_608 - 1 & (uint)local_608;
        local_608 = (ulong)uVar68;
        if (uVar68 == 0) {
          return;
        }
        goto LAB_01cd9b1c;
      }
      lVar69 = uVar66 * 0x60;
      auVar93 = *(undefined1 (*) [32])(auStack_160 + lVar69);
      auVar160._0_4_ = fVar135 + auVar93._0_4_;
      auVar160._4_4_ = fVar164 + auVar93._4_4_;
      auVar160._8_4_ = fVar166 + auVar93._8_4_;
      auVar160._12_4_ = fVar168 + auVar93._12_4_;
      auVar160._16_4_ = fVar137 + auVar93._16_4_;
      auVar160._20_4_ = fVar170 + auVar93._20_4_;
      auVar160._24_4_ = fVar172 + auVar93._24_4_;
      auVar160._28_4_ = fVar202 + auVar93._28_4_;
      uVar136 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar40._4_4_ = uVar136;
      auVar40._0_4_ = uVar136;
      auVar40._8_4_ = uVar136;
      auVar40._12_4_ = uVar136;
      auVar40._16_4_ = uVar136;
      auVar40._20_4_ = uVar136;
      auVar40._24_4_ = uVar136;
      auVar40._28_4_ = uVar136;
      uVar16 = vcmpps_avx512vl(auVar160,auVar40,2);
      uVar76 = (uint)uVar16 & (uint)abStack_180[lVar69];
    } while (uVar76 == 0);
    uVar74 = (&uStack_140)[uVar66 * 0xc];
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar74;
    auVar198._8_4_ = 0x7f800000;
    auVar198._0_8_ = 0x7f8000007f800000;
    auVar198._12_4_ = 0x7f800000;
    auVar198._16_4_ = 0x7f800000;
    auVar198._20_4_ = 0x7f800000;
    auVar198._24_4_ = 0x7f800000;
    auVar198._28_4_ = 0x7f800000;
    auVar91 = vblendmps_avx512vl(auVar198,auVar93);
    bVar64 = (byte)uVar76;
    auVar123._0_4_ =
         (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)auVar93._0_4_;
    bVar8 = (bool)((byte)(uVar76 >> 1) & 1);
    auVar123._4_4_ = (uint)bVar8 * auVar91._4_4_ | (uint)!bVar8 * (int)auVar93._4_4_;
    bVar8 = (bool)((byte)(uVar76 >> 2) & 1);
    auVar123._8_4_ = (uint)bVar8 * auVar91._8_4_ | (uint)!bVar8 * (int)auVar93._8_4_;
    bVar8 = (bool)((byte)(uVar76 >> 3) & 1);
    auVar123._12_4_ = (uint)bVar8 * auVar91._12_4_ | (uint)!bVar8 * (int)auVar93._12_4_;
    bVar8 = (bool)((byte)(uVar76 >> 4) & 1);
    auVar123._16_4_ = (uint)bVar8 * auVar91._16_4_ | (uint)!bVar8 * (int)auVar93._16_4_;
    bVar8 = (bool)((byte)(uVar76 >> 5) & 1);
    auVar123._20_4_ = (uint)bVar8 * auVar91._20_4_ | (uint)!bVar8 * (int)auVar93._20_4_;
    bVar8 = (bool)((byte)(uVar76 >> 6) & 1);
    auVar123._24_4_ = (uint)bVar8 * auVar91._24_4_ | (uint)!bVar8 * (int)auVar93._24_4_;
    auVar123._28_4_ =
         (uVar76 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar76 >> 7,0) * (int)auVar93._28_4_;
    auVar93 = vshufps_avx(auVar123,auVar123,0xb1);
    auVar93 = vminps_avx(auVar123,auVar93);
    auVar91 = vshufpd_avx(auVar93,auVar93,5);
    auVar93 = vminps_avx(auVar93,auVar91);
    auVar91 = vpermpd_avx2(auVar93,0x4e);
    auVar93 = vminps_avx(auVar93,auVar91);
    uVar16 = vcmpps_avx512vl(auVar123,auVar93,0);
    bVar67 = (byte)uVar16 & bVar64;
    if (bVar67 != 0) {
      uVar76 = (uint)bVar67;
    }
    uVar128 = 0;
    for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
      uVar128 = uVar128 + 1;
    }
    local_9ac = aiStack_138[uVar66 * 0x18];
    bVar64 = ~('\x01' << ((byte)uVar128 & 0x1f)) & bVar64;
    abStack_180[lVar69] = bVar64;
    if (bVar64 == 0) {
      uVar77 = uVar77 - 1;
    }
    uVar136 = (undefined4)uVar74;
    auVar145._4_4_ = uVar136;
    auVar145._0_4_ = uVar136;
    auVar145._8_4_ = uVar136;
    auVar145._12_4_ = uVar136;
    auVar145._16_4_ = uVar136;
    auVar145._20_4_ = uVar136;
    auVar145._24_4_ = uVar136;
    auVar145._28_4_ = uVar136;
    auVar80 = vmovshdup_avx(auVar151);
    auVar80 = vsubps_avx(auVar80,auVar151);
    auVar161._0_4_ = auVar80._0_4_;
    auVar161._4_4_ = auVar161._0_4_;
    auVar161._8_4_ = auVar161._0_4_;
    auVar161._12_4_ = auVar161._0_4_;
    auVar161._16_4_ = auVar161._0_4_;
    auVar161._20_4_ = auVar161._0_4_;
    auVar161._24_4_ = auVar161._0_4_;
    auVar161._28_4_ = auVar161._0_4_;
    auVar80 = vfmadd132ps_fma(auVar161,auVar145,_DAT_01faff20);
    _local_460 = ZEXT1632(auVar80);
    local_330._8_8_ = 0;
    local_330._0_8_ = *(ulong *)(local_460 + (ulong)uVar128 * 4);
    uVar66 = (ulong)uVar77;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }